

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  float *pfVar6;
  Scene **ppSVar7;
  RTCRayQueryFlags *pRVar8;
  undefined1 (*pauVar9) [12];
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [16];
  unkbyte9 Var63;
  undefined1 auVar64 [13];
  undefined1 auVar65 [12];
  undefined1 auVar66 [13];
  undefined1 auVar67 [12];
  undefined1 auVar68 [13];
  undefined1 auVar69 [12];
  undefined1 auVar70 [13];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined6 uVar73;
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [15];
  bool bVar88;
  bool bVar89;
  bool bVar90;
  bool bVar91;
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [13];
  undefined1 auVar99 [15];
  ulong uVar100;
  long lVar101;
  RTCFilterFunctionN p_Var102;
  RTCRayN *pRVar103;
  long lVar104;
  RTCIntersectArguments *pRVar105;
  RayQueryContext *pRVar106;
  long lVar107;
  undefined4 uVar108;
  undefined8 unaff_RBP;
  ulong uVar110;
  byte bVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  short sVar117;
  int iVar118;
  int iVar173;
  undefined1 auVar119 [12];
  undefined1 auVar124 [16];
  char cVar176;
  undefined1 auVar127 [16];
  undefined1 auVar121 [12];
  undefined1 auVar131 [16];
  undefined1 auVar122 [12];
  undefined1 auVar135 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar123 [12];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined8 uVar177;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar170;
  undefined1 auVar171 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar195;
  float fVar197;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar196;
  float fVar198;
  float fVar199;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  char cVar200;
  float fVar201;
  char cVar214;
  float fVar215;
  float fVar219;
  vfloat4 v;
  float fVar202;
  float fVar203;
  undefined1 auVar206 [16];
  float fVar216;
  undefined1 auVar209 [16];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  char cVar238;
  float fVar239;
  float fVar242;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  float fVar240;
  float fVar241;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar250;
  float fVar251;
  float fVar261;
  float fVar263;
  undefined1 auVar252 [16];
  float fVar262;
  float fVar264;
  float fVar265;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar266;
  float fVar276;
  float fVar277;
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar279;
  float fVar287;
  float fVar290;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar291;
  float fVar292;
  undefined1 auVar285 [16];
  float fVar289;
  float fVar293;
  undefined1 auVar286 [16];
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar295 [16];
  float fVar300;
  float fVar301;
  undefined1 uVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar302 [16];
  undefined1 auVar305 [16];
  float fVar311;
  float fVar312;
  float fVar321;
  float fVar322;
  undefined1 auVar313 [16];
  float fVar323;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar324;
  float fVar330;
  float fVar332;
  undefined1 auVar325 [16];
  float fVar331;
  float fVar333;
  undefined1 auVar328 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar329;
  float fVar341;
  undefined1 auVar334 [16];
  undefined1 auVar337 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar338;
  undefined1 auVar339 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar340;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar350;
  float fVar351;
  float fVar355;
  float fVar356;
  float fVar358;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar346;
  float fVar352;
  float fVar357;
  float fVar359;
  undefined1 auVar347 [16];
  float fVar353;
  float fVar354;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar348;
  undefined1 auVar349 [16];
  float fVar360;
  float fVar370;
  float fVar371;
  undefined1 auVar361 [16];
  float fVar372;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar373;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar383 [16];
  undefined1 auVar386 [16];
  float fVar393;
  float fVar394;
  short local_4f8;
  undefined2 uStack_4f6;
  undefined2 uStack_4f4;
  undefined2 uStack_4f2;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_418;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  undefined4 uStack_3dc;
  undefined1 local_3c8 [16];
  ulong local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 (*local_358) [16];
  Precalculations *local_350;
  RTCFilterFunctionNArguments args;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar109;
  undefined1 auVar120 [12];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined2 uVar172;
  int iVar174;
  int iVar175;
  undefined1 auVar204 [12];
  undefined1 auVar207 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  
  PVar18 = prim[1];
  uVar100 = (ulong)(byte)PVar18;
  lVar104 = uVar100 * 0x25;
  uVar108 = *(undefined4 *)(prim + uVar100 * 4 + 6);
  uVar19 = *(undefined4 *)(prim + uVar100 * 5 + 6);
  uVar20 = *(undefined4 *)(prim + uVar100 * 6 + 6);
  uVar21 = *(undefined4 *)(prim + uVar100 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar100 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar100 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar100 * 0x1b + 6);
  auVar140 = *(undefined1 (*) [16])(prim + lVar104 + 6);
  auVar228._12_4_ = auVar140._12_4_;
  fVar178 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar104 + 0x16)) *
            *(float *)(prim + lVar104 + 0x1a);
  auVar119._0_8_ = CONCAT44(auVar228._12_4_,auVar228._12_4_);
  auVar119._8_4_ = auVar228._12_4_;
  auVar228._0_12_ = auVar119;
  fVar266 = (*(float *)(ray + k * 4) - auVar140._0_4_) * auVar228._12_4_;
  fVar276 = (*(float *)(ray + k * 4 + 0x10) - auVar140._4_4_) * auVar228._12_4_;
  fVar277 = (*(float *)(ray + k * 4 + 0x20) - auVar140._8_4_) * auVar228._12_4_;
  fVar342 = *(float *)(ray + k * 4 + 0x40) * auVar228._12_4_;
  fVar350 = *(float *)(ray + k * 4 + 0x50) * auVar228._12_4_;
  fVar355 = *(float *)(ray + k * 4 + 0x60) * auVar228._12_4_;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar228._0_13_;
  auVar30[0xe] = auVar140[0xf];
  auVar34[0xc] = auVar140[0xe];
  auVar34._0_12_ = auVar119;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar119._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = auVar140[0xd];
  auVar42._0_10_ = auVar119._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar119._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = auVar140[0xc];
  auVar50._0_8_ = auVar119._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar19 >> 0x18)),auVar140[0xf]);
  auVar54._6_9_ = Var63;
  auVar54[5] = (char)((uint)uVar19 >> 0x10);
  auVar54[4] = auVar140[0xe];
  auVar54._0_4_ = auVar228._12_4_;
  cVar214 = (char)((uint)uVar19 >> 8);
  auVar64._2_11_ = auVar54._4_11_;
  auVar64[1] = cVar214;
  auVar64[0] = auVar140[0xd];
  cVar200 = (char)uVar19;
  sVar117 = CONCAT11(cVar200,auVar140[0xc]);
  auVar58._2_13_ = auVar64;
  auVar58._0_2_ = sVar117;
  uVar172 = (undefined2)Var63;
  auVar125._0_12_ = auVar58._0_12_;
  auVar125._12_2_ = uVar172;
  auVar125._14_2_ = uVar172;
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._0_10_ = auVar58._0_10_;
  auVar124._10_2_ = auVar54._4_2_;
  auVar140._10_6_ = auVar124._10_6_;
  auVar140._0_8_ = auVar58._0_8_;
  auVar140._8_2_ = auVar54._4_2_;
  auVar65._4_8_ = auVar140._8_8_;
  auVar65._2_2_ = auVar64._0_2_;
  auVar65._0_2_ = auVar64._0_2_;
  iVar118 = (int)sVar117 >> 8;
  iVar173 = auVar65._0_4_ >> 0x18;
  auVar120._0_8_ = CONCAT44(iVar173,iVar118);
  auVar120._8_4_ = auVar140._8_4_ >> 0x18;
  auVar126._12_4_ = auVar124._12_4_ >> 0x18;
  auVar126._0_12_ = auVar120;
  fVar330 = (float)iVar173;
  cVar176 = cVar214 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar126._0_13_;
  auVar31[0xe] = cVar176;
  auVar35[0xc] = cVar176;
  auVar35._0_12_ = auVar120;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar120._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar176;
  auVar43._0_10_ = auVar120._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar120._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar214;
  auVar51._0_8_ = auVar120._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar200 >> 7);
  auVar55._6_9_ = Var63;
  auVar55[5] = (char)((uint)uVar20 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar200 >> 7);
  auVar55._0_4_ = iVar118;
  cVar238 = (char)((uint)uVar20 >> 8);
  auVar66._2_11_ = auVar55._4_11_;
  auVar66[1] = cVar238;
  auVar66[0] = (undefined1)((short)cVar200 >> 7);
  cVar214 = (char)uVar20;
  auVar59._2_13_ = auVar66;
  auVar59._0_2_ = CONCAT11(cVar214,cVar200);
  uVar172 = (undefined2)Var63;
  auVar129._0_12_ = auVar59._0_12_;
  auVar129._12_2_ = uVar172;
  auVar129._14_2_ = uVar172;
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_10_ = auVar59._0_10_;
  auVar128._10_2_ = auVar55._4_2_;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._0_8_ = auVar59._0_8_;
  auVar127._8_2_ = auVar55._4_2_;
  auVar67._4_8_ = auVar127._8_8_;
  auVar67._2_2_ = auVar66._0_2_;
  auVar67._0_2_ = auVar66._0_2_;
  iVar173 = (int)CONCAT11(cVar214,cVar200) >> 8;
  iVar174 = auVar67._0_4_ >> 0x18;
  auVar121._0_8_ = CONCAT44(iVar174,iVar173);
  auVar121._8_4_ = auVar127._8_4_ >> 0x18;
  auVar130._12_4_ = auVar128._12_4_ >> 0x18;
  auVar130._0_12_ = auVar121;
  fVar341 = (float)iVar174;
  cVar176 = cVar238 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar130._0_13_;
  auVar32[0xe] = cVar176;
  auVar36[0xc] = cVar176;
  auVar36._0_12_ = auVar121;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar121._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar176;
  auVar44._0_10_ = auVar121._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar121._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = cVar238;
  auVar52._0_8_ = auVar121._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar214 >> 7);
  auVar56._6_9_ = Var63;
  auVar56[5] = (char)((uint)uVar22 >> 0x10);
  auVar56[4] = (undefined1)((short)cVar214 >> 7);
  auVar56._0_4_ = iVar173;
  cVar238 = (char)((uint)uVar22 >> 8);
  auVar68._2_11_ = auVar56._4_11_;
  auVar68[1] = cVar238;
  auVar68[0] = (undefined1)((short)cVar214 >> 7);
  cVar200 = (char)uVar22;
  auVar60._2_13_ = auVar68;
  auVar60._0_2_ = CONCAT11(cVar200,cVar214);
  uVar172 = (undefined2)Var63;
  auVar133._0_12_ = auVar60._0_12_;
  auVar133._12_2_ = uVar172;
  auVar133._14_2_ = uVar172;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar60._0_10_;
  auVar132._10_2_ = auVar56._4_2_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._0_8_ = auVar60._0_8_;
  auVar131._8_2_ = auVar56._4_2_;
  auVar69._4_8_ = auVar131._8_8_;
  auVar69._2_2_ = auVar68._0_2_;
  auVar69._0_2_ = auVar68._0_2_;
  iVar174 = (int)CONCAT11(cVar200,cVar214) >> 8;
  iVar175 = auVar69._0_4_ >> 0x18;
  auVar122._0_8_ = CONCAT44(iVar175,iVar174);
  auVar122._8_4_ = auVar131._8_4_ >> 0x18;
  auVar134._12_4_ = auVar132._12_4_ >> 0x18;
  auVar134._0_12_ = auVar122;
  fVar296 = (float)iVar175;
  cVar176 = cVar238 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar134._0_13_;
  auVar33[0xe] = cVar176;
  auVar37[0xc] = cVar176;
  auVar37._0_12_ = auVar122;
  auVar37._13_2_ = auVar33._13_2_;
  auVar41[0xb] = 0;
  auVar41._0_11_ = auVar122._0_11_;
  auVar41._12_3_ = auVar37._12_3_;
  auVar45[10] = cVar176;
  auVar45._0_10_ = auVar122._0_10_;
  auVar45._11_4_ = auVar41._11_4_;
  auVar49[9] = 0;
  auVar49._0_9_ = auVar122._0_9_;
  auVar49._10_5_ = auVar45._10_5_;
  auVar53[8] = cVar238;
  auVar53._0_8_ = auVar122._0_8_;
  auVar53._9_6_ = auVar49._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar53._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar200 >> 7);
  auVar57._6_9_ = Var63;
  auVar57[5] = (char)((uint)uVar23 >> 0x10);
  auVar57[4] = (undefined1)((short)cVar200 >> 7);
  auVar57._0_4_ = iVar174;
  auVar70._2_11_ = auVar57._4_11_;
  auVar70[1] = (char)((uint)uVar23 >> 8);
  auVar70[0] = (undefined1)((short)cVar200 >> 7);
  sVar117 = CONCAT11((char)uVar23,cVar200);
  auVar61._2_13_ = auVar70;
  auVar61._0_2_ = sVar117;
  uVar172 = (undefined2)Var63;
  auVar137._0_12_ = auVar61._0_12_;
  auVar137._12_2_ = uVar172;
  auVar137._14_2_ = uVar172;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar61._0_10_;
  auVar136._10_2_ = auVar57._4_2_;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar61._0_8_;
  auVar135._8_2_ = auVar57._4_2_;
  auVar71._4_8_ = auVar135._8_8_;
  auVar71._2_2_ = auVar70._0_2_;
  auVar71._0_2_ = auVar70._0_2_;
  fVar179 = (float)((int)sVar117 >> 8);
  fVar195 = (float)(auVar71._0_4_ >> 0x18);
  fVar197 = (float)(auVar135._8_4_ >> 0x18);
  fVar201 = fVar355 * fVar179;
  fVar215 = fVar355 * fVar195;
  auVar204._0_8_ = CONCAT44(fVar215,fVar201);
  auVar204._8_4_ = fVar355 * fVar197;
  auVar205._12_4_ = fVar355 * (float)(auVar136._12_4_ >> 0x18);
  auVar205._0_12_ = auVar204;
  uVar19 = *(undefined4 *)(prim + uVar100 * 0x1c + 6);
  local_458._0_1_ = (undefined1)uVar108;
  local_458._1_1_ = (undefined1)((uint)uVar108 >> 8);
  uStack_456._0_1_ = (undefined1)((uint)uVar108 >> 0x10);
  uStack_456._1_1_ = (undefined1)((uint)uVar108 >> 0x18);
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar205._0_13_;
  auVar87[0xe] = (char)((uint)fVar215 >> 0x18);
  auVar92[0xc] = (char)((uint)fVar215 >> 0x10);
  auVar92._0_12_ = auVar204;
  auVar92._13_2_ = auVar87._13_2_;
  auVar93[0xb] = 0;
  auVar93._0_11_ = auVar204._0_11_;
  auVar93._12_3_ = auVar92._12_3_;
  auVar94[10] = (char)((uint)fVar215 >> 8);
  auVar94._0_10_ = auVar204._0_10_;
  auVar94._11_4_ = auVar93._11_4_;
  auVar95[9] = 0;
  auVar95._0_9_ = auVar204._0_9_;
  auVar95._10_5_ = auVar94._10_5_;
  auVar96[8] = SUB41(fVar215,0);
  auVar96._0_8_ = auVar204._0_8_;
  auVar96._9_6_ = auVar95._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar96._8_7_,uStack_456._1_1_),(char)((uint)fVar201 >> 0x18));
  auVar97._6_9_ = Var63;
  auVar97[5] = (undefined1)uStack_456;
  auVar97[4] = (char)((uint)fVar201 >> 0x10);
  auVar97._0_4_ = fVar201;
  auVar98._2_11_ = auVar97._4_11_;
  auVar98[1] = local_458._1_1_;
  auVar98[0] = (char)((uint)fVar201 >> 8);
  sVar117 = CONCAT11((undefined1)local_458,SUB41(fVar201,0));
  auVar99._2_13_ = auVar98;
  auVar99._0_2_ = sVar117;
  uVar172 = (undefined2)Var63;
  auVar208._0_12_ = auVar99._0_12_;
  auVar208._12_2_ = uVar172;
  auVar208._14_2_ = uVar172;
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._0_10_ = auVar99._0_10_;
  auVar207._10_2_ = auVar97._4_2_;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._0_8_ = auVar99._0_8_;
  auVar206._8_2_ = auVar97._4_2_;
  auVar72._4_8_ = auVar206._8_8_;
  auVar72._2_2_ = auVar98._0_2_;
  auVar72._0_2_ = auVar98._0_2_;
  fVar278 = (float)((int)sVar117 >> 8);
  fVar287 = (float)(auVar72._0_4_ >> 0x18);
  fVar290 = (float)(auVar206._8_4_ >> 0x18);
  uVar306 = (undefined1)((uint)uVar21 >> 0x18);
  uVar172 = CONCAT11(uVar306,uVar306);
  uVar306 = (undefined1)((uint)uVar21 >> 0x10);
  uVar177 = CONCAT35(CONCAT21(uVar172,uVar306),CONCAT14(uVar306,uVar21));
  uVar306 = (undefined1)((uint)uVar21 >> 8);
  uVar73 = CONCAT51(CONCAT41((int)((ulong)uVar177 >> 0x20),uVar306),uVar306);
  sVar117 = CONCAT11((char)uVar21,(char)uVar21);
  uVar109 = CONCAT62(uVar73,sVar117);
  auVar385._8_4_ = 0;
  auVar385._0_8_ = uVar109;
  auVar385._12_2_ = uVar172;
  auVar385._14_2_ = uVar172;
  uVar172 = (undefined2)((ulong)uVar177 >> 0x20);
  auVar384._12_4_ = auVar385._12_4_;
  auVar384._8_2_ = 0;
  auVar384._0_8_ = uVar109;
  auVar384._10_2_ = uVar172;
  auVar383._10_6_ = auVar384._10_6_;
  auVar383._8_2_ = uVar172;
  auVar383._0_8_ = uVar109;
  uVar172 = (undefined2)uVar73;
  auVar74._4_8_ = auVar383._8_8_;
  auVar74._2_2_ = uVar172;
  auVar74._0_2_ = uVar172;
  fVar202 = (float)((int)sVar117 >> 8);
  fVar216 = (float)(auVar74._0_4_ >> 0x18);
  fVar219 = (float)(auVar383._8_4_ >> 0x18);
  uVar306 = (undefined1)((uint)uVar24 >> 0x18);
  uVar172 = CONCAT11(uVar306,uVar306);
  uVar306 = (undefined1)((uint)uVar24 >> 0x10);
  uVar177 = CONCAT35(CONCAT21(uVar172,uVar306),CONCAT14(uVar306,uVar24));
  uVar306 = (undefined1)((uint)uVar24 >> 8);
  uVar73 = CONCAT51(CONCAT41((int)((ulong)uVar177 >> 0x20),uVar306),uVar306);
  sVar117 = CONCAT11((char)uVar24,(char)uVar24);
  uVar109 = CONCAT62(uVar73,sVar117);
  auVar363._8_4_ = 0;
  auVar363._0_8_ = uVar109;
  auVar363._12_2_ = uVar172;
  auVar363._14_2_ = uVar172;
  uVar172 = (undefined2)((ulong)uVar177 >> 0x20);
  auVar362._12_4_ = auVar363._12_4_;
  auVar362._8_2_ = 0;
  auVar362._0_8_ = uVar109;
  auVar362._10_2_ = uVar172;
  auVar361._10_6_ = auVar362._10_6_;
  auVar361._8_2_ = uVar172;
  auVar361._0_8_ = uVar109;
  uVar172 = (undefined2)uVar73;
  auVar75._4_8_ = auVar361._8_8_;
  auVar75._2_2_ = uVar172;
  auVar75._0_2_ = uVar172;
  fVar250 = (float)((int)sVar117 >> 8);
  fVar261 = (float)(auVar75._0_4_ >> 0x18);
  fVar263 = (float)(auVar361._8_4_ >> 0x18);
  uVar306 = (undefined1)((uint)uVar25 >> 0x18);
  uVar172 = CONCAT11(uVar306,uVar306);
  uVar306 = (undefined1)((uint)uVar25 >> 0x10);
  uVar177 = CONCAT35(CONCAT21(uVar172,uVar306),CONCAT14(uVar306,uVar25));
  uVar306 = (undefined1)((uint)uVar25 >> 8);
  uVar73 = CONCAT51(CONCAT41((int)((ulong)uVar177 >> 0x20),uVar306),uVar306);
  sVar117 = CONCAT11((char)uVar25,(char)uVar25);
  uVar109 = CONCAT62(uVar73,sVar117);
  auVar315._8_4_ = 0;
  auVar315._0_8_ = uVar109;
  auVar315._12_2_ = uVar172;
  auVar315._14_2_ = uVar172;
  uVar172 = (undefined2)((ulong)uVar177 >> 0x20);
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._8_2_ = 0;
  auVar314._0_8_ = uVar109;
  auVar314._10_2_ = uVar172;
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._8_2_ = uVar172;
  auVar313._0_8_ = uVar109;
  uVar172 = (undefined2)uVar73;
  auVar76._4_8_ = auVar313._8_8_;
  auVar76._2_2_ = uVar172;
  auVar76._0_2_ = uVar172;
  fVar380 = (float)((int)sVar117 >> 8);
  fVar387 = (float)(auVar76._0_4_ >> 0x18);
  fVar390 = (float)(auVar313._8_4_ >> 0x18);
  uVar306 = (undefined1)((uint)uVar19 >> 0x18);
  uVar172 = CONCAT11(uVar306,uVar306);
  uVar306 = (undefined1)((uint)uVar19 >> 0x10);
  uVar177 = CONCAT35(CONCAT21(uVar172,uVar306),CONCAT14(uVar306,uVar19));
  uVar306 = (undefined1)((uint)uVar19 >> 8);
  uVar73 = CONCAT51(CONCAT41((int)((ulong)uVar177 >> 0x20),uVar306),uVar306);
  sVar117 = CONCAT11((char)uVar19,(char)uVar19);
  uVar109 = CONCAT62(uVar73,sVar117);
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar109;
  auVar304._12_2_ = uVar172;
  auVar304._14_2_ = uVar172;
  uVar172 = (undefined2)((ulong)uVar177 >> 0x20);
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._8_2_ = 0;
  auVar303._0_8_ = uVar109;
  auVar303._10_2_ = uVar172;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._8_2_ = uVar172;
  auVar302._0_8_ = uVar109;
  uVar172 = (undefined2)uVar73;
  auVar77._4_8_ = auVar302._8_8_;
  auVar77._2_2_ = uVar172;
  auVar77._0_2_ = uVar172;
  fVar300 = (float)((int)sVar117 >> 8);
  fVar307 = (float)(auVar77._0_4_ >> 0x18);
  fVar309 = (float)(auVar302._8_4_ >> 0x18);
  fVar360 = fVar342 * fVar278 + fVar350 * (float)iVar118 + fVar355 * (float)iVar173;
  fVar370 = fVar342 * fVar287 + fVar350 * fVar330 + fVar355 * fVar341;
  fVar371 = fVar342 * fVar290 + fVar350 * (float)auVar120._8_4_ + fVar355 * (float)auVar121._8_4_;
  fVar372 = fVar342 * (float)(auVar207._12_4_ >> 0x18) +
            fVar350 * (float)auVar126._12_4_ + fVar355 * (float)auVar130._12_4_;
  fVar312 = fVar342 * fVar202 + fVar350 * (float)iVar174 + fVar201;
  fVar321 = fVar342 * fVar216 + fVar350 * fVar296 + fVar215;
  fVar322 = fVar342 * fVar219 + fVar350 * (float)auVar122._8_4_ + auVar204._8_4_;
  fVar323 = fVar342 * (float)(auVar384._12_4_ >> 0x18) +
            fVar350 * (float)auVar134._12_4_ + auVar205._12_4_;
  fVar201 = fVar342 * fVar250 + fVar350 * fVar380 + fVar355 * fVar300;
  fVar215 = fVar342 * fVar261 + fVar350 * fVar387 + fVar355 * fVar307;
  fVar242 = fVar342 * fVar263 + fVar350 * fVar390 + fVar355 * fVar309;
  fVar342 = fVar342 * (float)(auVar362._12_4_ >> 0x18) +
            fVar350 * (float)(auVar314._12_4_ >> 0x18) + fVar355 * (float)(auVar303._12_4_ >> 0x18);
  uVar177 = *(undefined8 *)(prim + uVar100 * 7 + 6);
  uVar10 = *(undefined8 *)(prim + uVar100 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar100 * 9 + 6);
  fVar350 = fVar278 * fVar266 + (float)iVar118 * fVar276 + (float)iVar173 * fVar277;
  fVar330 = fVar287 * fVar266 + fVar330 * fVar276 + fVar341 * fVar277;
  fVar341 = fVar290 * fVar266 + (float)auVar120._8_4_ * fVar276 + (float)auVar121._8_4_ * fVar277;
  fVar355 = (float)(auVar207._12_4_ >> 0x18) * fVar266 +
            (float)auVar126._12_4_ * fVar276 + (float)auVar130._12_4_ * fVar277;
  fVar343 = fVar202 * fVar266 + (float)iVar174 * fVar276 + fVar179 * fVar277;
  fVar351 = fVar216 * fVar266 + fVar296 * fVar276 + fVar195 * fVar277;
  fVar356 = fVar219 * fVar266 + (float)auVar122._8_4_ * fVar276 + fVar197 * fVar277;
  fVar358 = (float)(auVar384._12_4_ >> 0x18) * fVar266 +
            (float)auVar134._12_4_ * fVar276 + (float)(auVar136._12_4_ >> 0x18) * fVar277;
  fVar278 = fVar266 * fVar250 + fVar276 * fVar380 + fVar277 * fVar300;
  fVar287 = fVar266 * fVar261 + fVar276 * fVar387 + fVar277 * fVar307;
  fVar290 = fVar266 * fVar263 + fVar276 * fVar390 + fVar277 * fVar309;
  fVar296 = fVar266 * (float)(auVar362._12_4_ >> 0x18) +
            fVar276 * (float)(auVar314._12_4_ >> 0x18) + fVar277 * (float)(auVar303._12_4_ >> 0x18);
  uVar112 = -(uint)(1e-18 <= ABS(fVar360));
  uVar113 = -(uint)(1e-18 <= ABS(fVar370));
  uVar114 = -(uint)(1e-18 <= ABS(fVar371));
  uVar115 = -(uint)(1e-18 <= ABS(fVar372));
  auVar364._0_4_ = (uint)fVar360 & uVar112;
  auVar364._4_4_ = (uint)fVar370 & uVar113;
  auVar364._8_4_ = (uint)fVar371 & uVar114;
  auVar364._12_4_ = (uint)fVar372 & uVar115;
  auVar138._0_8_ = CONCAT44(~uVar113,~uVar112) & 0x219392ef219392ef;
  auVar138._8_4_ = ~uVar114 & 0x219392ef;
  auVar138._12_4_ = ~uVar115 & 0x219392ef;
  auVar138 = auVar138 | auVar364;
  uVar112 = -(uint)(1e-18 <= ABS(fVar312));
  uVar113 = -(uint)(1e-18 <= ABS(fVar321));
  uVar114 = -(uint)(1e-18 <= ABS(fVar322));
  uVar115 = -(uint)(1e-18 <= ABS(fVar323));
  auVar316._0_4_ = (uint)fVar312 & uVar112;
  auVar316._4_4_ = (uint)fVar321 & uVar113;
  auVar316._8_4_ = (uint)fVar322 & uVar114;
  auVar316._12_4_ = (uint)fVar323 & uVar115;
  auVar280._0_8_ = CONCAT44(~uVar113,~uVar112) & 0x219392ef219392ef;
  auVar280._8_4_ = ~uVar114 & 0x219392ef;
  auVar280._12_4_ = ~uVar115 & 0x219392ef;
  auVar280 = auVar280 | auVar316;
  uVar112 = -(uint)(1e-18 <= ABS(fVar201));
  uVar113 = -(uint)(1e-18 <= ABS(fVar215));
  uVar114 = -(uint)(1e-18 <= ABS(fVar242));
  uVar115 = -(uint)(1e-18 <= ABS(fVar342));
  auVar227._0_4_ = (uint)fVar201 & uVar112;
  auVar227._4_4_ = (uint)fVar215 & uVar113;
  auVar227._8_4_ = (uint)fVar242 & uVar114;
  auVar227._12_4_ = (uint)fVar342 & uVar115;
  auVar365._0_8_ = CONCAT44(~uVar113,~uVar112) & 0x219392ef219392ef;
  auVar365._8_4_ = ~uVar114 & 0x219392ef;
  auVar365._12_4_ = ~uVar115 & 0x219392ef;
  auVar365 = auVar365 | auVar227;
  auVar228 = rcpps(auVar227,auVar138);
  auVar229._0_4_ = auVar228._0_4_;
  auVar139._0_4_ = auVar138._0_4_ * auVar229._0_4_;
  fVar300 = auVar228._4_4_;
  auVar139._4_4_ = auVar138._4_4_ * fVar300;
  fVar307 = auVar228._8_4_;
  auVar139._8_4_ = auVar138._8_4_ * fVar307;
  fVar309 = auVar228._12_4_;
  auVar139._12_4_ = auVar138._12_4_ * fVar309;
  fVar321 = (1.0 - auVar139._0_4_) * auVar229._0_4_ + auVar229._0_4_;
  fVar300 = (1.0 - auVar139._4_4_) * fVar300 + fVar300;
  fVar307 = (1.0 - auVar139._8_4_) * fVar307 + fVar307;
  fVar309 = (1.0 - auVar139._12_4_) * fVar309 + fVar309;
  auVar140 = rcpps(auVar139,auVar280);
  fVar179 = auVar140._0_4_;
  fVar195 = auVar140._4_4_;
  fVar242 = auVar140._8_4_;
  fVar276 = auVar140._12_4_;
  fVar179 = (1.0 - auVar280._0_4_ * fVar179) * fVar179 + fVar179;
  fVar195 = (1.0 - auVar280._4_4_ * fVar195) * fVar195 + fVar195;
  fVar242 = (1.0 - auVar280._8_4_ * fVar242) * fVar242 + fVar242;
  fVar276 = (1.0 - auVar280._12_4_ * fVar276) * fVar276 + fVar276;
  auVar140 = rcpps(auVar140,auVar365);
  auVar141._0_4_ = auVar140._0_4_;
  fVar197 = auVar140._4_4_;
  fVar342 = auVar140._8_4_;
  fVar277 = auVar140._12_4_;
  fVar312 = (1.0 - auVar365._0_4_ * auVar141._0_4_) * auVar141._0_4_ + auVar141._0_4_;
  fVar197 = (1.0 - auVar365._4_4_ * fVar197) * fVar197 + fVar197;
  fVar342 = (1.0 - auVar365._8_4_ * fVar342) * fVar342 + fVar342;
  fVar277 = (1.0 - auVar365._12_4_ * fVar277) * fVar277 + fVar277;
  local_458 = (short)uVar177;
  uStack_456 = (undefined2)((ulong)uVar177 >> 0x10);
  uStack_454 = (undefined2)((ulong)uVar177 >> 0x20);
  uStack_452 = (undefined2)((ulong)uVar177 >> 0x30);
  auVar144._0_12_ = auVar140._0_12_;
  auVar144._12_2_ = auVar140._6_2_;
  auVar144._14_2_ = uStack_452;
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._0_10_ = auVar140._0_10_;
  auVar143._10_2_ = uStack_454;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = auVar140._0_8_;
  auVar142._8_2_ = auVar140._4_2_;
  auVar141._8_8_ = auVar142._8_8_;
  auVar141._6_2_ = uStack_456;
  auVar141._4_2_ = auVar140._2_2_;
  auVar145._0_4_ = (float)(int)local_458;
  fVar201 = (float)(auVar141._4_4_ >> 0x10);
  auVar123._0_8_ = CONCAT44(fVar201,auVar145._0_4_);
  auVar123._8_4_ = (float)(auVar142._8_4_ >> 0x10);
  local_4f8 = (short)uVar10;
  uStack_4f6 = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_4f4 = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_4f2 = (undefined2)((ulong)uVar10 >> 0x30);
  auVar232._0_12_ = auVar228._0_12_;
  auVar232._12_2_ = auVar228._6_2_;
  auVar232._14_2_ = uStack_4f2;
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._0_10_ = auVar228._0_10_;
  auVar231._10_2_ = uStack_4f4;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._0_8_ = auVar228._0_8_;
  auVar230._8_2_ = auVar228._4_2_;
  auVar229._8_8_ = auVar230._8_8_;
  auVar229._6_2_ = uStack_4f6;
  auVar229._4_2_ = auVar228._2_2_;
  auVar148._12_2_ = (short)((uint)fVar201 >> 0x10);
  auVar148._0_12_ = auVar123;
  auVar148._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._0_10_ = auVar123._0_10_;
  auVar147._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = SUB42(fVar201,0);
  auVar146._0_8_ = auVar123._0_8_;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar145._4_2_ = (short)((uint)auVar145._0_4_ >> 0x10);
  fVar202 = (float)(auVar145._4_4_ >> 0x10);
  fVar250 = (float)(auVar146._8_4_ >> 0x10);
  uVar109 = *(ulong *)(prim + uVar100 * 0xd + 6);
  uVar172 = (undefined2)(uVar109 >> 0x30);
  auVar269._8_4_ = 0;
  auVar269._0_8_ = uVar109;
  auVar269._12_2_ = uVar172;
  auVar269._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar109 >> 0x20);
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._8_2_ = 0;
  auVar268._0_8_ = uVar109;
  auVar268._10_2_ = uVar172;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._8_2_ = uVar172;
  auVar267._0_8_ = uVar109;
  uVar172 = (undefined2)(uVar109 >> 0x10);
  auVar78._4_8_ = auVar267._8_8_;
  auVar78._2_2_ = uVar172;
  auVar78._0_2_ = uVar172;
  uVar110 = *(ulong *)(prim + uVar100 * 0x12 + 6);
  uVar172 = (undefined2)(uVar110 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar110;
  auVar151._12_2_ = uVar172;
  auVar151._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar110 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar110;
  auVar150._10_2_ = uVar172;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar172;
  auVar149._0_8_ = uVar110;
  uVar172 = (undefined2)(uVar110 >> 0x10);
  auVar79._4_8_ = auVar149._8_8_;
  auVar79._2_2_ = uVar172;
  auVar79._0_2_ = uVar172;
  fVar215 = (float)(auVar79._0_4_ >> 0x10);
  fVar261 = (float)(auVar149._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar100 * 0x16 + 6);
  uVar172 = (undefined2)(uVar12 >> 0x30);
  auVar283._8_4_ = 0;
  auVar283._0_8_ = uVar12;
  auVar283._12_2_ = uVar172;
  auVar283._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar12 >> 0x20);
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._8_2_ = 0;
  auVar282._0_8_ = uVar12;
  auVar282._10_2_ = uVar172;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._8_2_ = uVar172;
  auVar281._0_8_ = uVar12;
  uVar172 = (undefined2)(uVar12 >> 0x10);
  auVar80._4_8_ = auVar281._8_8_;
  auVar80._2_2_ = uVar172;
  auVar80._0_2_ = uVar172;
  uVar13 = *(ulong *)(prim + uVar100 * 0x14 + 6);
  uVar172 = (undefined2)(uVar13 >> 0x30);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar13;
  auVar154._12_2_ = uVar172;
  auVar154._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar13 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar13;
  auVar153._10_2_ = uVar172;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar172;
  auVar152._0_8_ = uVar13;
  uVar172 = (undefined2)(uVar13 >> 0x10);
  auVar81._4_8_ = auVar152._8_8_;
  auVar81._2_2_ = uVar172;
  auVar81._0_2_ = uVar172;
  fVar216 = (float)(auVar81._0_4_ >> 0x10);
  fVar263 = (float)(auVar152._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar100 * 0x18 + 6);
  uVar172 = (undefined2)(uVar14 >> 0x30);
  auVar327._8_4_ = 0;
  auVar327._0_8_ = uVar14;
  auVar327._12_2_ = uVar172;
  auVar327._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar14 >> 0x20);
  auVar326._12_4_ = auVar327._12_4_;
  auVar326._8_2_ = 0;
  auVar326._0_8_ = uVar14;
  auVar326._10_2_ = uVar172;
  auVar325._10_6_ = auVar326._10_6_;
  auVar325._8_2_ = uVar172;
  auVar325._0_8_ = uVar14;
  uVar172 = (undefined2)(uVar14 >> 0x10);
  auVar82._4_8_ = auVar325._8_8_;
  auVar82._2_2_ = uVar172;
  auVar82._0_2_ = uVar172;
  uVar15 = *(ulong *)(prim + uVar100 * 0x1d + 6);
  uVar172 = (undefined2)(uVar15 >> 0x30);
  auVar157._8_4_ = 0;
  auVar157._0_8_ = uVar15;
  auVar157._12_2_ = uVar172;
  auVar157._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar15 >> 0x20);
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar15;
  auVar156._10_2_ = uVar172;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = uVar172;
  auVar155._0_8_ = uVar15;
  uVar172 = (undefined2)(uVar15 >> 0x10);
  auVar83._4_8_ = auVar155._8_8_;
  auVar83._2_2_ = uVar172;
  auVar83._0_2_ = uVar172;
  fVar219 = (float)(auVar83._0_4_ >> 0x10);
  fVar266 = (float)(auVar155._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar100 * 0x21 + 6);
  uVar172 = (undefined2)(uVar16 >> 0x30);
  auVar336._8_4_ = 0;
  auVar336._0_8_ = uVar16;
  auVar336._12_2_ = uVar172;
  auVar336._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar16 >> 0x20);
  auVar335._12_4_ = auVar336._12_4_;
  auVar335._8_2_ = 0;
  auVar335._0_8_ = uVar16;
  auVar335._10_2_ = uVar172;
  auVar334._10_6_ = auVar335._10_6_;
  auVar334._8_2_ = uVar172;
  auVar334._0_8_ = uVar16;
  uVar172 = (undefined2)(uVar16 >> 0x10);
  auVar84._4_8_ = auVar334._8_8_;
  auVar84._2_2_ = uVar172;
  auVar84._0_2_ = uVar172;
  uVar17 = *(ulong *)(prim + uVar100 * 0x1f + 6);
  uVar172 = (undefined2)(uVar17 >> 0x30);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar17;
  auVar160._12_2_ = uVar172;
  auVar160._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar17 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar17;
  auVar159._10_2_ = uVar172;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar172;
  auVar158._0_8_ = uVar17;
  uVar172 = (undefined2)(uVar17 >> 0x10);
  auVar85._4_8_ = auVar158._8_8_;
  auVar85._2_2_ = uVar172;
  auVar85._0_2_ = uVar172;
  fVar322 = (float)(auVar85._0_4_ >> 0x10);
  fVar323 = (float)(auVar158._8_4_ >> 0x10);
  uVar100 = *(ulong *)(prim + uVar100 * 0x23 + 6);
  uVar172 = (undefined2)(uVar100 >> 0x30);
  auVar163._8_4_ = 0;
  auVar163._0_8_ = uVar100;
  auVar163._12_2_ = uVar172;
  auVar163._14_2_ = uVar172;
  uVar172 = (undefined2)(uVar100 >> 0x20);
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._8_2_ = 0;
  auVar162._0_8_ = uVar100;
  auVar162._10_2_ = uVar172;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = uVar172;
  auVar161._0_8_ = uVar100;
  uVar172 = (undefined2)(uVar100 >> 0x10);
  auVar86._4_8_ = auVar161._8_8_;
  auVar86._2_2_ = uVar172;
  auVar86._0_2_ = uVar172;
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar233._0_8_ =
       CONCAT44(((((float)(auVar229._4_4_ >> 0x10) - fVar201) * fVar178 + fVar201) - fVar330) *
                fVar300,((((float)(int)local_4f8 - auVar145._0_4_) * fVar178 + auVar145._0_4_) -
                        fVar350) * fVar321);
  auVar233._8_4_ =
       ((((float)(auVar230._8_4_ >> 0x10) - auVar123._8_4_) * fVar178 + auVar123._8_4_) - fVar341) *
       fVar307;
  auVar233._12_4_ =
       ((((float)(auVar231._12_4_ >> 0x10) - (float)(auVar143._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar143._12_4_ >> 0x10)) - fVar355) * fVar309;
  auVar270._0_4_ =
       ((((float)(int)(short)uVar109 - (float)(int)(short)uVar11) * fVar178 +
        (float)(int)(short)uVar11) - fVar350) * fVar321;
  auVar270._4_4_ =
       ((((float)(auVar78._0_4_ >> 0x10) - fVar202) * fVar178 + fVar202) - fVar330) * fVar300;
  auVar270._8_4_ =
       ((((float)(auVar267._8_4_ >> 0x10) - fVar250) * fVar178 + fVar250) - fVar341) * fVar307;
  auVar270._12_4_ =
       ((((float)(auVar268._12_4_ >> 0x10) - (float)(auVar147._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar147._12_4_ >> 0x10)) - fVar355) * fVar309;
  auVar284._0_8_ =
       CONCAT44(((((float)(auVar80._0_4_ >> 0x10) - fVar215) * fVar178 + fVar215) - fVar351) *
                fVar195,((((float)(int)(short)uVar12 - (float)(int)(short)uVar110) * fVar178 +
                         (float)(int)(short)uVar110) - fVar343) * fVar179);
  auVar284._8_4_ =
       ((((float)(auVar281._8_4_ >> 0x10) - fVar261) * fVar178 + fVar261) - fVar356) * fVar242;
  auVar284._12_4_ =
       ((((float)(auVar282._12_4_ >> 0x10) - (float)(auVar150._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar150._12_4_ >> 0x10)) - fVar358) * fVar276;
  aVar329._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar178 +
        (float)(int)(short)uVar13) - fVar343) * fVar179;
  aVar329._4_4_ =
       ((((float)(auVar82._0_4_ >> 0x10) - fVar216) * fVar178 + fVar216) - fVar351) * fVar195;
  aVar329._8_4_ =
       ((((float)(auVar325._8_4_ >> 0x10) - fVar263) * fVar178 + fVar263) - fVar356) * fVar242;
  aVar329._12_4_ =
       ((((float)(auVar326._12_4_ >> 0x10) - (float)(auVar153._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar153._12_4_ >> 0x10)) - fVar358) * fVar276;
  auVar337._0_8_ =
       CONCAT44(((((float)(auVar84._0_4_ >> 0x10) - fVar219) * fVar178 + fVar219) - fVar287) *
                fVar197,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar178 +
                         (float)(int)(short)uVar15) - fVar278) * fVar312);
  auVar337._8_4_ =
       ((((float)(auVar334._8_4_ >> 0x10) - fVar266) * fVar178 + fVar266) - fVar290) * fVar342;
  auVar337._12_4_ =
       ((((float)(auVar335._12_4_ >> 0x10) - (float)(auVar156._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar156._12_4_ >> 0x10)) - fVar296) * fVar277;
  aVar346._0_4_ =
       ((((float)(int)(short)uVar100 - (float)(int)(short)uVar17) * fVar178 +
        (float)(int)(short)uVar17) - fVar278) * fVar312;
  aVar346._4_4_ =
       ((((float)(auVar86._0_4_ >> 0x10) - fVar322) * fVar178 + fVar322) - fVar287) * fVar197;
  aVar346._8_4_ =
       ((((float)(auVar161._8_4_ >> 0x10) - fVar323) * fVar178 + fVar323) - fVar290) * fVar342;
  aVar346._12_4_ =
       ((((float)(auVar162._12_4_ >> 0x10) - (float)(auVar159._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar159._12_4_ >> 0x10)) - fVar296) * fVar277;
  auVar209._8_4_ = auVar233._8_4_;
  auVar209._0_8_ = auVar233._0_8_;
  auVar209._12_4_ = auVar233._12_4_;
  auVar228 = minps(auVar209,auVar270);
  auVar181._8_4_ = auVar284._8_4_;
  auVar181._0_8_ = auVar284._0_8_;
  auVar181._12_4_ = auVar284._12_4_;
  auVar140 = minps(auVar181,(undefined1  [16])aVar329);
  auVar228 = maxps(auVar228,auVar140);
  auVar182._8_4_ = auVar337._8_4_;
  auVar182._0_8_ = auVar337._0_8_;
  auVar182._12_4_ = auVar337._12_4_;
  auVar140 = minps(auVar182,(undefined1  [16])aVar346);
  auVar164._4_4_ = uVar108;
  auVar164._0_4_ = uVar108;
  auVar164._8_4_ = uVar108;
  auVar164._12_4_ = uVar108;
  auVar140 = maxps(auVar140,auVar164);
  auVar140 = maxps(auVar228,auVar140);
  local_48 = auVar140._0_4_ * 0.99999964;
  fStack_44 = auVar140._4_4_ * 0.99999964;
  fStack_40 = auVar140._8_4_ * 0.99999964;
  fStack_3c = auVar140._12_4_ * 0.99999964;
  auVar140 = maxps(auVar233,auVar270);
  auVar228 = maxps(auVar284,(undefined1  [16])aVar329);
  auVar140 = minps(auVar140,auVar228);
  auVar228 = maxps(auVar337,(undefined1  [16])aVar346);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar183._4_4_ = uVar108;
  auVar183._0_4_ = uVar108;
  auVar183._8_4_ = uVar108;
  auVar183._12_4_ = uVar108;
  aVar338 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar228,auVar183);
  auVar140 = minps(auVar140,(undefined1  [16])aVar338);
  auVar184._0_4_ = -(uint)(PVar18 != (Primitive)0x0 && local_48 <= auVar140._0_4_ * 1.0000004);
  auVar184._4_4_ = -(uint)(1 < (byte)PVar18 && fStack_44 <= auVar140._4_4_ * 1.0000004);
  auVar184._8_4_ = -(uint)(2 < (byte)PVar18 && fStack_40 <= auVar140._8_4_ * 1.0000004);
  auVar184._12_4_ = -(uint)(3 < (byte)PVar18 && fStack_3c <= auVar140._12_4_ * 1.0000004);
  uVar108 = movmskps((int)unaff_RBP,auVar184);
  local_3a8 = mm_lookupmask_ps._0_8_;
  uStack_3a0 = mm_lookupmask_ps._8_8_;
  local_358 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_350 = pre;
  for (uVar109 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar108); uVar109 != 0;
      uVar109 = (ulong)((uint)uVar109 & (uint)uVar109 + 0xf & uVar112)) {
    lVar104 = 0;
    if (uVar109 != 0) {
      for (; (uVar109 >> lVar104 & 1) == 0; lVar104 = lVar104 + 1) {
      }
    }
    local_3b0 = (ulong)*(uint *)(prim + 2);
    uStack_310._0_4_ = *(uint *)(prim + lVar104 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[local_3b0].ptr;
    uVar110 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)(uint)uStack_310 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar197 = pGVar26->fnumTimeSegments;
    fVar201 = (pGVar26->time_range).lower;
    fVar202 = ((*(float *)(ray + k * 4 + 0x70) - fVar201) / ((pGVar26->time_range).upper - fVar201))
              * fVar197;
    fVar201 = floorf(fVar202);
    fVar197 = fVar197 + -1.0;
    if (fVar197 <= fVar201) {
      fVar201 = fVar197;
    }
    fVar197 = 0.0;
    if (0.0 <= fVar201) {
      fVar197 = fVar201;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar101 = (long)(int)fVar197 * 0x38;
    lVar107 = *(long *)(_Var27 + 0x10 + lVar101);
    lVar28 = *(long *)(_Var27 + 0x38 + lVar101);
    lVar29 = *(long *)(_Var27 + 0x48 + lVar101);
    pfVar1 = (float *)(lVar28 + lVar29 * uVar110);
    lVar104 = uVar110 + 1;
    pfVar2 = (float *)(lVar28 + lVar29 * lVar104);
    p_Var102 = pGVar26[4].occlusionFilterN;
    pfVar3 = (float *)(*(long *)(_Var27 + lVar101) + lVar107 * uVar110);
    pfVar4 = (float *)(*(long *)(_Var27 + lVar101) + lVar107 * lVar104);
    pRVar106 = *(RayQueryContext **)(p_Var102 + lVar101 + 0x38);
    pRVar105 = (RTCIntersectArguments *)(*(long *)(p_Var102 + lVar101 + 0x10) * lVar104);
    ppSVar5 = (Scene **)((long)&pRVar106->scene + uVar110 * *(long *)(p_Var102 + lVar101 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var102 + lVar101) +
                      *(long *)(p_Var102 + lVar101 + 0x10) * uVar110);
    fVar202 = fVar202 - fVar197;
    fVar216 = 1.0 - fVar202;
    local_398 = *pfVar3 * fVar216 + *pfVar1 * fVar202;
    fStack_394 = pfVar3[1] * fVar216 + pfVar1[1] * fVar202;
    fStack_390 = pfVar3[2] * fVar216 + pfVar1[2] * fVar202;
    fVar290 = pfVar3[3] * fVar216 + pfVar1[3] * fVar202;
    fVar355 = *pfVar4 * fVar216 + *pfVar2 * fVar202;
    fVar300 = pfVar4[1] * fVar216 + pfVar2[1] * fVar202;
    fVar307 = pfVar4[2] * fVar216 + pfVar2[2] * fVar202;
    fVar309 = pfVar4[3] * fVar216 + pfVar2[3] * fVar202;
    ppSVar7 = (Scene **)((long)&pRVar106->scene + *(long *)(p_Var102 + lVar101 + 0x48) * lVar104);
    pfVar1 = (float *)((long)&pRVar105->flags + *(long *)(p_Var102 + lVar101));
    iVar118 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar197 = *(float *)(ray + k * 4);
    fVar201 = *(float *)(ray + k * 4 + 0x10);
    fVar215 = *(float *)(ray + k * 4 + 0x20);
    fVar312 = (*pfVar6 * fVar216 + *(float *)ppSVar5 * fVar202) * 0.33333334 + local_398;
    fVar321 = (pfVar6[1] * fVar216 + *(float *)((long)ppSVar5 + 4) * fVar202) * 0.33333334 +
              fStack_394;
    fVar322 = (pfVar6[2] * fVar216 + *(float *)(ppSVar5 + 1) * fVar202) * 0.33333334 + fStack_390;
    fVar323 = (pfVar6[3] * fVar216 + *(float *)((long)ppSVar5 + 0xc) * fVar202) * 0.33333334 +
              fVar290;
    fVar356 = fVar355 - (fVar216 * *pfVar1 + fVar202 * *(float *)ppSVar7) * 0.33333334;
    fVar358 = fVar300 - (fVar216 * pfVar1[1] + fVar202 * *(float *)((long)ppSVar7 + 4)) * 0.33333334
    ;
    fVar360 = fVar307 - (fVar216 * pfVar1[2] + fVar202 * *(float *)(ppSVar7 + 1)) * 0.33333334;
    fVar370 = fVar309 - (fVar216 * pfVar1[3] + fVar202 * *(float *)((long)ppSVar7 + 0xc)) *
                        0.33333334;
    fVar178 = local_398 - fVar197;
    fVar278 = fStack_394 - fVar201;
    fVar287 = fStack_390 - fVar215;
    fVar202 = pre->ray_space[k].vx.field_0.m128[0];
    fVar216 = pre->ray_space[k].vx.field_0.m128[1];
    fVar219 = pre->ray_space[k].vx.field_0.m128[2];
    fVar342 = pre->ray_space[k].vy.field_0.m128[0];
    fVar250 = pre->ray_space[k].vy.field_0.m128[1];
    fVar261 = pre->ray_space[k].vy.field_0.m128[2];
    fVar263 = pre->ray_space[k].vz.field_0.m128[0];
    fVar266 = pre->ray_space[k].vz.field_0.m128[1];
    fVar277 = pre->ray_space[k].vz.field_0.m128[2];
    fVar296 = fVar178 * fVar202 + fVar278 * fVar342 + fVar287 * fVar263;
    fVar350 = fVar178 * fVar216 + fVar278 * fVar250 + fVar287 * fVar266;
    fVar330 = fVar178 * fVar219 + fVar278 * fVar261 + fVar287 * fVar277;
    fVar178 = fVar312 - fVar197;
    fVar278 = fVar321 - fVar201;
    fVar287 = fVar322 - fVar215;
    fVar343 = fVar178 * fVar202 + fVar278 * fVar342 + fVar287 * fVar263;
    fVar351 = fVar178 * fVar216 + fVar278 * fVar250 + fVar287 * fVar266;
    local_378 = fVar178 * fVar219 + fVar278 * fVar261 + fVar287 * fVar277;
    fVar178 = fVar356 - fVar197;
    fVar278 = fVar358 - fVar201;
    fVar287 = fVar360 - fVar215;
    fVar341 = fVar178 * fVar202 + fVar278 * fVar342 + fVar287 * fVar263;
    local_368 = fVar178 * fVar216 + fVar278 * fVar250 + fVar287 * fVar266;
    local_388 = fVar178 * fVar219 + fVar278 * fVar261 + fVar287 * fVar277;
    fVar197 = fVar355 - fVar197;
    fVar201 = fVar300 - fVar201;
    fVar215 = fVar307 - fVar215;
    fVar202 = fVar197 * fVar202 + fVar201 * fVar342 + fVar215 * fVar263;
    fVar216 = fVar197 * fVar216 + fVar201 * fVar250 + fVar215 * fVar266;
    fVar201 = fVar197 * fVar219 + fVar201 * fVar261 + fVar215 * fVar277;
    auVar317._0_8_ = CONCAT44(fVar350,fVar296) & 0x7fffffff7fffffff;
    auVar317._8_4_ = ABS(fVar330);
    auVar317._12_4_ = ABS(fVar290);
    auVar252._0_8_ = CONCAT44(fVar351,fVar343) & 0x7fffffff7fffffff;
    auVar252._8_4_ = ABS(local_378);
    auVar252._12_4_ = ABS(fVar323);
    auVar228 = maxps(auVar317,auVar252);
    auVar271._0_8_ = CONCAT44(local_368,fVar341) & 0x7fffffff7fffffff;
    auVar271._8_4_ = ABS(local_388);
    auVar271._12_4_ = ABS(fVar370);
    auVar185._0_8_ = CONCAT44(fVar216,fVar202) & 0x7fffffff7fffffff;
    auVar185._8_4_ = ABS(fVar201);
    auVar185._12_4_ = ABS(fVar309);
    auVar140 = maxps(auVar271,auVar185);
    auVar140 = maxps(auVar228,auVar140);
    uVar177 = auVar140._8_8_;
    fVar197 = auVar140._4_4_;
    if (auVar140._4_4_ <= auVar140._0_4_) {
      fVar197 = auVar140._0_4_;
    }
    fVar215 = (float)iVar118;
    auVar318._8_8_ = uVar177;
    auVar318._0_8_ = uVar177;
    if (auVar140._8_4_ <= fVar197) {
      auVar319._4_12_ = auVar318._4_12_;
      auVar319._0_4_ = fVar197;
      uVar177 = auVar319._0_8_;
    }
    lVar104 = (long)iVar118 * 0x44;
    fVar219 = *(float *)(bezier_basis0 + lVar104 + 0x908);
    fVar342 = *(float *)(bezier_basis0 + lVar104 + 0x90c);
    fVar250 = *(float *)(bezier_basis0 + lVar104 + 0x910);
    fVar261 = *(float *)(bezier_basis0 + lVar104 + 0x914);
    fVar197 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar104 + 0xd8c);
    fVar263 = *(float *)(bezier_basis0 + lVar104 + 0xd90);
    fVar266 = *(float *)(bezier_basis0 + lVar104 + 0xd94);
    auVar65 = *(undefined1 (*) [12])(bezier_basis0 + lVar104 + 0xd8c);
    fVar277 = *(float *)(bezier_basis0 + lVar104 + 0xd98);
    fVar178 = *(float *)(bezier_basis0 + lVar104 + 0x484);
    fVar278 = *(float *)(bezier_basis0 + lVar104 + 0x488);
    fVar287 = *(float *)(bezier_basis0 + lVar104 + 0x48c);
    fVar371 = *(float *)(bezier_basis0 + lVar104 + 0x490);
    fVar372 = *(float *)(bezier_basis0 + lVar104);
    fVar380 = *(float *)(bezier_basis0 + lVar104 + 4);
    fVar387 = *(float *)(bezier_basis0 + lVar104 + 8);
    fVar390 = *(float *)(bezier_basis0 + lVar104 + 0xc);
    fVar344 = fVar296 * fVar372 + fVar343 * fVar178 + fVar341 * fVar219 + fVar202 * fVar197;
    fVar352 = fVar296 * fVar380 + fVar343 * fVar278 + fVar341 * fVar342 + fVar202 * fVar263;
    fVar357 = fVar296 * fVar387 + fVar343 * fVar287 + fVar341 * fVar250 + fVar202 * fVar266;
    fVar359 = fVar296 * fVar390 + fVar343 * fVar371 + fVar341 * fVar261 + fVar202 * fVar277;
    fVar224 = fVar350 * fVar372 + fVar351 * fVar178 + local_368 * fVar219 + fVar216 * fVar197;
    fVar239 = fVar350 * fVar380 + fVar351 * fVar278 + local_368 * fVar342 + fVar216 * fVar263;
    fVar243 = fVar350 * fVar387 + fVar351 * fVar287 + local_368 * fVar250 + fVar216 * fVar266;
    fVar247 = fVar350 * fVar390 + fVar351 * fVar371 + local_368 * fVar261 + fVar216 * fVar277;
    auVar386._0_4_ = fVar290 * fVar372 + fVar323 * fVar178 + fVar370 * fVar219 + fVar309 * fVar197;
    auVar386._4_4_ = fVar290 * fVar380 + fVar323 * fVar278 + fVar370 * fVar342 + fVar309 * fVar263;
    auVar386._8_4_ = fVar290 * fVar387 + fVar323 * fVar287 + fVar370 * fVar250 + fVar309 * fVar266;
    auVar386._12_4_ = fVar290 * fVar390 + fVar323 * fVar371 + fVar370 * fVar261 + fVar309 * fVar277;
    fVar263 = *(float *)(bezier_basis1 + lVar104 + 0xd8c);
    fVar266 = *(float *)(bezier_basis1 + lVar104 + 0xd90);
    fVar289 = *(float *)(bezier_basis1 + lVar104 + 0xd94);
    fVar246 = *(float *)(bezier_basis1 + lVar104 + 0xd98);
    fVar197 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar104 + 0x908);
    fVar218 = *(float *)(bezier_basis1 + lVar104 + 0x90c);
    fVar221 = *(float *)(bezier_basis1 + lVar104 + 0x910);
    auVar67 = *(undefined1 (*) [12])(bezier_basis1 + lVar104 + 0x908);
    fVar293 = *(float *)(bezier_basis1 + lVar104 + 0x914);
    fVar301 = *(float *)(bezier_basis1 + lVar104 + 0x484);
    fVar308 = *(float *)(bezier_basis1 + lVar104 + 0x488);
    fVar310 = *(float *)(bezier_basis1 + lVar104 + 0x48c);
    fVar311 = *(float *)(bezier_basis1 + lVar104 + 0x490);
    fVar382 = *(float *)(bezier_basis1 + lVar104);
    fVar389 = *(float *)(bezier_basis1 + lVar104 + 4);
    fVar392 = *(float *)(bezier_basis1 + lVar104 + 8);
    fVar394 = *(float *)(bezier_basis1 + lVar104 + 0xc);
    fVar294 = fVar296 * fVar382 + fVar343 * fVar301 + fVar341 * fVar197 + fVar202 * fVar263;
    fVar297 = fVar296 * fVar389 + fVar343 * fVar308 + fVar341 * fVar218 + fVar202 * fVar266;
    fVar298 = fVar296 * fVar392 + fVar343 * fVar310 + fVar341 * fVar221 + fVar202 * fVar289;
    fVar299 = fVar296 * fVar394 + fVar343 * fVar311 + fVar341 * fVar293 + fVar202 * fVar246;
    fVar203 = fVar350 * fVar382 + fVar351 * fVar301 + local_368 * fVar197 + fVar216 * fVar263;
    fVar217 = fVar350 * fVar389 + fVar351 * fVar308 + local_368 * fVar218 + fVar216 * fVar266;
    fVar220 = fVar350 * fVar392 + fVar351 * fVar310 + local_368 * fVar221 + fVar216 * fVar289;
    fVar222 = fVar350 * fVar394 + fVar351 * fVar311 + local_368 * fVar293 + fVar216 * fVar246;
    auVar165._0_4_ = fVar290 * fVar382 + fVar323 * fVar301 + fVar370 * fVar197 + fVar309 * fVar263;
    auVar165._4_4_ = fVar290 * fVar389 + fVar323 * fVar308 + fVar370 * fVar218 + fVar309 * fVar266;
    auVar165._8_4_ = fVar290 * fVar392 + fVar323 * fVar310 + fVar370 * fVar221 + fVar309 * fVar289;
    auVar165._12_4_ = fVar290 * fVar394 + fVar323 * fVar311 + fVar370 * fVar293 + fVar309 * fVar246;
    fVar279 = fVar294 - fVar344;
    fVar288 = fVar297 - fVar352;
    fVar291 = fVar298 - fVar357;
    fVar292 = fVar299 - fVar359;
    fVar251 = fVar203 - fVar224;
    fVar262 = fVar217 - fVar239;
    fVar264 = fVar220 - fVar243;
    fVar265 = fVar222 - fVar247;
    fVar197 = fVar224 * fVar279 - fVar344 * fVar251;
    fVar218 = fVar239 * fVar288 - fVar352 * fVar262;
    fVar221 = fVar243 * fVar291 - fVar357 * fVar264;
    fVar223 = fVar247 * fVar292 - fVar359 * fVar265;
    auVar140 = maxps(auVar386,auVar165);
    bVar90 = fVar197 * fVar197 <=
             auVar140._0_4_ * auVar140._0_4_ * (fVar279 * fVar279 + fVar251 * fVar251) &&
             0.0 < fVar215;
    auVar210._0_4_ = -(uint)bVar90;
    bVar91 = fVar218 * fVar218 <=
             auVar140._4_4_ * auVar140._4_4_ * (fVar288 * fVar288 + fVar262 * fVar262) &&
             1.0 < fVar215;
    auVar210._4_4_ = -(uint)bVar91;
    bVar89 = fVar221 * fVar221 <=
             auVar140._8_4_ * auVar140._8_4_ * (fVar291 * fVar291 + fVar264 * fVar264) &&
             2.0 < fVar215;
    auVar210._8_4_ = -(uint)bVar89;
    bVar88 = fVar223 * fVar223 <=
             auVar140._12_4_ * auVar140._12_4_ * (fVar292 * fVar292 + fVar265 * fVar265) &&
             3.0 < fVar215;
    auVar210._12_4_ = -(uint)bVar88;
    local_418 = (float)uVar177;
    local_418 = local_418 * 4.7683716e-07;
    iVar173 = movmskps((int)(pre->ray_space + k),auVar210);
    fVar197 = *(float *)(ray + k * 4 + 0x30);
    fStack_38c = fVar290;
    fStack_384 = local_388;
    fStack_380 = local_388;
    fStack_37c = local_388;
    fStack_374 = local_378;
    fStack_370 = local_378;
    fStack_36c = local_378;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    if (iVar173 == 0) {
      bVar111 = 0;
    }
    else {
      local_268 = auVar67._0_4_;
      fStack_264 = auVar67._4_4_;
      fStack_260 = auVar67._8_4_;
      fVar225 = fVar263 * fVar201 + local_268 * local_388 + fVar301 * local_378 + fVar382 * fVar330;
      fVar240 = fVar266 * fVar201 + fStack_264 * local_388 + fVar308 * local_378 + fVar389 * fVar330
      ;
      fVar244 = fVar289 * fVar201 + fStack_260 * local_388 + fVar310 * local_378 + fVar392 * fVar330
      ;
      fVar248 = fVar246 * fVar201 + fVar293 * local_388 + fVar311 * local_378 + fVar394 * fVar330;
      local_3f8 = auVar65._0_4_;
      fStack_3f4 = auVar65._4_4_;
      fStack_3f0 = auVar65._8_4_;
      fVar226 = local_3f8 * fVar201 + fVar219 * local_388 + fVar178 * local_378 + fVar372 * fVar330;
      fVar241 = fStack_3f4 * fVar201 + fVar342 * local_388 + fVar278 * local_378 + fVar380 * fVar330
      ;
      fVar245 = fStack_3f0 * fVar201 + fVar250 * local_388 + fVar287 * local_378 + fVar387 * fVar330
      ;
      fVar249 = fVar277 * fVar201 + fVar261 * local_388 + fVar371 * local_378 + fVar390 * fVar330;
      fVar219 = *(float *)(bezier_basis0 + lVar104 + 0x1210);
      fVar342 = *(float *)(bezier_basis0 + lVar104 + 0x1214);
      fVar250 = *(float *)(bezier_basis0 + lVar104 + 0x1218);
      fVar261 = *(float *)(bezier_basis0 + lVar104 + 0x121c);
      fVar263 = *(float *)(bezier_basis0 + lVar104 + 0x1694);
      fVar266 = *(float *)(bezier_basis0 + lVar104 + 0x1698);
      fVar277 = *(float *)(bezier_basis0 + lVar104 + 0x169c);
      fVar178 = *(float *)(bezier_basis0 + lVar104 + 0x16a0);
      fVar278 = *(float *)(bezier_basis0 + lVar104 + 0x1b18);
      fVar287 = *(float *)(bezier_basis0 + lVar104 + 0x1b1c);
      fVar371 = *(float *)(bezier_basis0 + lVar104 + 0x1b20);
      fVar372 = *(float *)(bezier_basis0 + lVar104 + 0x1b24);
      fVar380 = *(float *)(bezier_basis0 + lVar104 + 0x1f9c);
      fVar387 = *(float *)(bezier_basis0 + lVar104 + 0x1fa0);
      fVar390 = *(float *)(bezier_basis0 + lVar104 + 0x1fa4);
      fVar289 = *(float *)(bezier_basis0 + lVar104 + 0x1fa8);
      fVar324 = fVar296 * fVar219 + fVar343 * fVar263 + fVar341 * fVar278 + fVar202 * fVar380;
      fVar331 = fVar296 * fVar342 + fVar343 * fVar266 + fVar341 * fVar287 + fVar202 * fVar387;
      fVar332 = fVar296 * fVar250 + fVar343 * fVar277 + fVar341 * fVar371 + fVar202 * fVar390;
      fVar333 = fVar296 * fVar261 + fVar343 * fVar178 + fVar341 * fVar372 + fVar202 * fVar289;
      fVar381 = fVar350 * fVar219 + fVar351 * fVar263 + local_368 * fVar278 + fVar216 * fVar380;
      fVar388 = fVar350 * fVar342 + fVar351 * fVar266 + local_368 * fVar287 + fVar216 * fVar387;
      fVar391 = fVar350 * fVar250 + fVar351 * fVar277 + local_368 * fVar371 + fVar216 * fVar390;
      fVar393 = fVar350 * fVar261 + fVar351 * fVar178 + local_368 * fVar372 + fVar216 * fVar289;
      fVar246 = *(float *)(bezier_basis1 + lVar104 + 0x1210);
      fVar218 = *(float *)(bezier_basis1 + lVar104 + 0x1214);
      fVar221 = *(float *)(bezier_basis1 + lVar104 + 0x1218);
      fVar293 = *(float *)(bezier_basis1 + lVar104 + 0x121c);
      fVar301 = *(float *)(bezier_basis1 + lVar104 + 0x1b18);
      fVar308 = *(float *)(bezier_basis1 + lVar104 + 0x1b1c);
      fVar310 = *(float *)(bezier_basis1 + lVar104 + 0x1b20);
      fVar311 = *(float *)(bezier_basis1 + lVar104 + 0x1b24);
      fVar382 = *(float *)(bezier_basis1 + lVar104 + 0x1f9c);
      fVar389 = *(float *)(bezier_basis1 + lVar104 + 0x1fa0);
      fVar392 = *(float *)(bezier_basis1 + lVar104 + 0x1fa4);
      fVar394 = *(float *)(bezier_basis1 + lVar104 + 0x1fa8);
      fVar223 = *(float *)(bezier_basis1 + lVar104 + 0x1694);
      fVar345 = *(float *)(bezier_basis1 + lVar104 + 0x1698);
      fVar353 = *(float *)(bezier_basis1 + lVar104 + 0x169c);
      fVar354 = *(float *)(bezier_basis1 + lVar104 + 0x16a0);
      fVar373 = fVar296 * fVar246 + fVar343 * fVar223 + fVar341 * fVar301 + fVar202 * fVar382;
      fVar377 = fVar296 * fVar218 + fVar343 * fVar345 + fVar341 * fVar308 + fVar202 * fVar389;
      fVar378 = fVar296 * fVar221 + fVar343 * fVar353 + fVar341 * fVar310 + fVar202 * fVar392;
      fVar379 = fVar296 * fVar293 + fVar343 * fVar354 + fVar341 * fVar311 + fVar202 * fVar394;
      fVar180 = fVar350 * fVar246 + fVar351 * fVar223 + local_368 * fVar301 + fVar216 * fVar382;
      fVar196 = fVar350 * fVar218 + fVar351 * fVar345 + local_368 * fVar308 + fVar216 * fVar389;
      fVar198 = fVar350 * fVar221 + fVar351 * fVar353 + local_368 * fVar310 + fVar216 * fVar392;
      fVar199 = fVar350 * fVar293 + fVar351 * fVar354 + local_368 * fVar311 + fVar216 * fVar394;
      auVar347._0_8_ = CONCAT44(fVar331,fVar324) & 0x7fffffff7fffffff;
      auVar347._8_4_ = ABS(fVar332);
      auVar347._12_4_ = ABS(fVar333);
      auVar305._0_8_ = CONCAT44(fVar388,fVar381) & 0x7fffffff7fffffff;
      auVar305._8_4_ = ABS(fVar391);
      auVar305._12_4_ = ABS(fVar393);
      auVar140 = maxps(auVar347,auVar305);
      auVar366._0_8_ =
           CONCAT44(fVar342 * fVar330 +
                    fVar266 * local_378 + fVar287 * local_388 + fVar387 * fVar201,
                    fVar219 * fVar330 +
                    fVar263 * local_378 + fVar278 * local_388 + fVar380 * fVar201) &
           0x7fffffff7fffffff;
      auVar366._8_4_ =
           ABS(fVar250 * fVar330 + fVar277 * local_378 + fVar371 * local_388 + fVar390 * fVar201);
      auVar366._12_4_ =
           ABS(fVar261 * fVar330 + fVar178 * local_378 + fVar372 * local_388 + fVar289 * fVar201);
      auVar140 = maxps(auVar140,auVar366);
      uVar112 = -(uint)(local_418 <= auVar140._0_4_);
      uVar113 = -(uint)(local_418 <= auVar140._4_4_);
      uVar114 = -(uint)(local_418 <= auVar140._8_4_);
      uVar115 = -(uint)(local_418 <= auVar140._12_4_);
      auVar62._4_4_ = fVar288;
      auVar62._0_4_ = fVar279;
      auVar62._8_4_ = fVar291;
      auVar62._12_4_ = fVar292;
      fVar263 = (float)((uint)fVar324 & uVar112 | ~uVar112 & (uint)fVar279);
      fVar266 = (float)((uint)fVar331 & uVar113 | ~uVar113 & (uint)fVar288);
      fVar277 = (float)((uint)fVar332 & uVar114 | ~uVar114 & (uint)fVar291);
      fVar178 = (float)((uint)fVar333 & uVar115 | ~uVar115 & (uint)fVar292);
      fVar278 = (float)(~uVar112 & (uint)fVar251 | (uint)fVar381 & uVar112);
      fVar287 = (float)(~uVar113 & (uint)fVar262 | (uint)fVar388 & uVar113);
      fVar371 = (float)(~uVar114 & (uint)fVar264 | (uint)fVar391 & uVar114);
      fVar372 = (float)(~uVar115 & (uint)fVar265 | (uint)fVar393 & uVar115);
      auVar367._0_8_ = CONCAT44(fVar377,fVar373) & 0x7fffffff7fffffff;
      auVar367._8_4_ = ABS(fVar378);
      auVar367._12_4_ = ABS(fVar379);
      auVar320._0_8_ = CONCAT44(fVar196,fVar180) & 0x7fffffff7fffffff;
      auVar320._8_4_ = ABS(fVar198);
      auVar320._12_4_ = ABS(fVar199);
      auVar140 = maxps(auVar367,auVar320);
      auVar285._0_8_ =
           CONCAT44(fVar218 * fVar330 +
                    fVar345 * local_378 + fVar308 * local_388 + fVar389 * fVar201,
                    fVar246 * fVar330 +
                    fVar223 * local_378 + fVar301 * local_388 + fVar382 * fVar201) &
           0x7fffffff7fffffff;
      auVar285._8_4_ =
           ABS(fVar221 * fVar330 + fVar353 * local_378 + fVar310 * local_388 + fVar392 * fVar201);
      auVar285._12_4_ =
           ABS(fVar293 * fVar330 + fVar354 * local_378 + fVar311 * local_388 + fVar394 * fVar201);
      auVar140 = maxps(auVar140,auVar285);
      uVar112 = -(uint)(local_418 <= auVar140._0_4_);
      uVar113 = -(uint)(local_418 <= auVar140._4_4_);
      uVar114 = -(uint)(local_418 <= auVar140._8_4_);
      uVar115 = -(uint)(local_418 <= auVar140._12_4_);
      fVar301 = (float)((uint)fVar373 & uVar112 | ~uVar112 & (uint)fVar279);
      fVar308 = (float)((uint)fVar377 & uVar113 | ~uVar113 & (uint)fVar288);
      fVar310 = (float)((uint)fVar378 & uVar114 | ~uVar114 & (uint)fVar291);
      fVar311 = (float)((uint)fVar379 & uVar115 | ~uVar115 & (uint)fVar292);
      fVar380 = (float)(~uVar112 & (uint)fVar251 | (uint)fVar180 & uVar112);
      fVar390 = (float)(~uVar113 & (uint)fVar262 | (uint)fVar196 & uVar113);
      fVar246 = (float)(~uVar114 & (uint)fVar264 | (uint)fVar198 & uVar114);
      fVar221 = (float)(~uVar115 & (uint)fVar265 | (uint)fVar199 & uVar115);
      auVar186._0_4_ = fVar278 * fVar278 + fVar263 * fVar263;
      auVar186._4_4_ = fVar287 * fVar287 + fVar266 * fVar266;
      auVar186._8_4_ = fVar371 * fVar371 + fVar277 * fVar277;
      auVar186._12_4_ = fVar372 * fVar372 + fVar178 * fVar178;
      auVar140 = rsqrtps(auVar62,auVar186);
      fVar219 = auVar140._0_4_;
      fVar342 = auVar140._4_4_;
      fVar250 = auVar140._8_4_;
      fVar261 = auVar140._12_4_;
      auVar253._0_4_ = fVar219 * fVar219 * auVar186._0_4_ * 0.5 * fVar219;
      auVar253._4_4_ = fVar342 * fVar342 * auVar186._4_4_ * 0.5 * fVar342;
      auVar253._8_4_ = fVar250 * fVar250 * auVar186._8_4_ * 0.5 * fVar250;
      auVar253._12_4_ = fVar261 * fVar261 * auVar186._12_4_ * 0.5 * fVar261;
      fVar382 = fVar219 * 1.5 - auVar253._0_4_;
      fVar389 = fVar342 * 1.5 - auVar253._4_4_;
      fVar392 = fVar250 * 1.5 - auVar253._8_4_;
      fVar394 = fVar261 * 1.5 - auVar253._12_4_;
      auVar187._0_4_ = fVar380 * fVar380 + fVar301 * fVar301;
      auVar187._4_4_ = fVar390 * fVar390 + fVar308 * fVar308;
      auVar187._8_4_ = fVar246 * fVar246 + fVar310 * fVar310;
      auVar187._12_4_ = fVar221 * fVar221 + fVar311 * fVar311;
      auVar140 = rsqrtps(auVar253,auVar187);
      fVar219 = auVar140._0_4_;
      fVar342 = auVar140._4_4_;
      fVar250 = auVar140._8_4_;
      fVar261 = auVar140._12_4_;
      fVar219 = fVar219 * 1.5 - fVar219 * fVar219 * auVar187._0_4_ * 0.5 * fVar219;
      fVar342 = fVar342 * 1.5 - fVar342 * fVar342 * auVar187._4_4_ * 0.5 * fVar342;
      fVar250 = fVar250 * 1.5 - fVar250 * fVar250 * auVar187._8_4_ * 0.5 * fVar250;
      fVar261 = fVar261 * 1.5 - fVar261 * fVar261 * auVar187._12_4_ * 0.5 * fVar261;
      fVar292 = fVar278 * fVar382 * auVar386._0_4_;
      fVar353 = fVar287 * fVar389 * auVar386._4_4_;
      fVar180 = fVar371 * fVar392 * auVar386._8_4_;
      fVar198 = fVar372 * fVar394 * auVar386._12_4_;
      fVar387 = -fVar263 * fVar382 * auVar386._0_4_;
      fVar289 = -fVar266 * fVar389 * auVar386._4_4_;
      fVar218 = -fVar277 * fVar392 * auVar386._8_4_;
      fVar293 = -fVar178 * fVar394 * auVar386._12_4_;
      fVar373 = fVar382 * 0.0 * auVar386._0_4_;
      fVar377 = fVar389 * 0.0 * auVar386._4_4_;
      fVar378 = fVar392 * 0.0 * auVar386._8_4_;
      fVar379 = fVar394 * 0.0 * auVar386._12_4_;
      fVar324 = fVar380 * fVar219 * auVar165._0_4_;
      fVar331 = fVar390 * fVar342 * auVar165._4_4_;
      fVar332 = fVar246 * fVar250 * auVar165._8_4_;
      fVar333 = fVar221 * fVar261 * auVar165._12_4_;
      fVar265 = fVar294 + fVar324;
      fVar279 = fVar297 + fVar331;
      fVar288 = fVar298 + fVar332;
      fVar291 = fVar299 + fVar333;
      fVar382 = -fVar301 * fVar219 * auVar165._0_4_;
      fVar389 = -fVar308 * fVar342 * auVar165._4_4_;
      fVar392 = -fVar310 * fVar250 * auVar165._8_4_;
      fVar394 = -fVar311 * fVar261 * auVar165._12_4_;
      fVar263 = fVar203 + fVar382;
      fVar266 = fVar217 + fVar389;
      fVar277 = fVar220 + fVar392;
      fVar178 = fVar222 + fVar394;
      fVar301 = fVar219 * 0.0 * auVar165._0_4_;
      fVar308 = fVar342 * 0.0 * auVar165._4_4_;
      fVar310 = fVar250 * 0.0 * auVar165._8_4_;
      fVar311 = fVar261 * 0.0 * auVar165._12_4_;
      fVar278 = fVar344 - fVar292;
      fVar287 = fVar352 - fVar353;
      fVar371 = fVar357 - fVar180;
      fVar372 = fVar359 - fVar198;
      fVar345 = fVar225 + fVar301;
      fVar354 = fVar240 + fVar308;
      fVar196 = fVar244 + fVar310;
      fVar199 = fVar248 + fVar311;
      fVar223 = fVar224 - fVar387;
      fVar251 = fVar239 - fVar289;
      fVar262 = fVar243 - fVar218;
      fVar264 = fVar247 - fVar293;
      fVar380 = fVar226 - fVar373;
      fVar390 = fVar241 - fVar377;
      fVar246 = fVar245 - fVar378;
      fVar221 = fVar249 - fVar379;
      uVar112 = -(uint)(0.0 < (fVar223 * (fVar345 - fVar380) - fVar380 * (fVar263 - fVar223)) * 0.0
                              + (fVar380 * (fVar265 - fVar278) - (fVar345 - fVar380) * fVar278) *
                                0.0 + ((fVar263 - fVar223) * fVar278 - (fVar265 - fVar278) * fVar223
                                      ));
      uVar113 = -(uint)(0.0 < (fVar251 * (fVar354 - fVar390) - fVar390 * (fVar266 - fVar251)) * 0.0
                              + (fVar390 * (fVar279 - fVar287) - (fVar354 - fVar390) * fVar287) *
                                0.0 + ((fVar266 - fVar251) * fVar287 - (fVar279 - fVar287) * fVar251
                                      ));
      uVar114 = -(uint)(0.0 < (fVar262 * (fVar196 - fVar246) - fVar246 * (fVar277 - fVar262)) * 0.0
                              + (fVar246 * (fVar288 - fVar371) - (fVar196 - fVar246) * fVar371) *
                                0.0 + ((fVar277 - fVar262) * fVar371 - (fVar288 - fVar371) * fVar262
                                      ));
      uVar115 = -(uint)(0.0 < (fVar264 * (fVar199 - fVar221) - fVar221 * (fVar178 - fVar264)) * 0.0
                              + (fVar221 * (fVar291 - fVar372) - (fVar199 - fVar221) * fVar372) *
                                0.0 + ((fVar178 - fVar264) * fVar372 - (fVar291 - fVar372) * fVar264
                                      ));
      fVar219 = (float)((uint)(fVar294 - fVar324) & uVar112 | ~uVar112 & (uint)(fVar344 + fVar292));
      fVar342 = (float)((uint)(fVar297 - fVar331) & uVar113 | ~uVar113 & (uint)(fVar352 + fVar353));
      fVar250 = (float)((uint)(fVar298 - fVar332) & uVar114 | ~uVar114 & (uint)(fVar357 + fVar180));
      fVar261 = (float)((uint)(fVar299 - fVar333) & uVar115 | ~uVar115 & (uint)(fVar359 + fVar198));
      fVar292 = (float)((uint)(fVar203 - fVar382) & uVar112 | ~uVar112 & (uint)(fVar224 + fVar387));
      fVar294 = (float)((uint)(fVar217 - fVar389) & uVar113 | ~uVar113 & (uint)(fVar239 + fVar289));
      fVar297 = (float)((uint)(fVar220 - fVar392) & uVar114 | ~uVar114 & (uint)(fVar243 + fVar218));
      fVar298 = (float)((uint)(fVar222 - fVar394) & uVar115 | ~uVar115 & (uint)(fVar247 + fVar293));
      fVar301 = (float)((uint)(fVar225 - fVar301) & uVar112 | ~uVar112 & (uint)(fVar226 + fVar373));
      fVar308 = (float)((uint)(fVar240 - fVar308) & uVar113 | ~uVar113 & (uint)(fVar241 + fVar377));
      fVar310 = (float)((uint)(fVar244 - fVar310) & uVar114 | ~uVar114 & (uint)(fVar245 + fVar378));
      fVar311 = (float)((uint)(fVar248 - fVar311) & uVar115 | ~uVar115 & (uint)(fVar249 + fVar379));
      fVar382 = (float)((uint)fVar278 & uVar112 | ~uVar112 & (uint)fVar265);
      fVar389 = (float)((uint)fVar287 & uVar113 | ~uVar113 & (uint)fVar279);
      fVar392 = (float)((uint)fVar371 & uVar114 | ~uVar114 & (uint)fVar288);
      fVar394 = (float)((uint)fVar372 & uVar115 | ~uVar115 & (uint)fVar291);
      fVar203 = (float)((uint)fVar223 & uVar112 | ~uVar112 & (uint)fVar263);
      fVar217 = (float)((uint)fVar251 & uVar113 | ~uVar113 & (uint)fVar266);
      fVar220 = (float)((uint)fVar262 & uVar114 | ~uVar114 & (uint)fVar277);
      fVar222 = (float)((uint)fVar264 & uVar115 | ~uVar115 & (uint)fVar178);
      fVar387 = (float)((uint)fVar380 & uVar112 | ~uVar112 & (uint)fVar345);
      fVar289 = (float)((uint)fVar390 & uVar113 | ~uVar113 & (uint)fVar354);
      fVar218 = (float)((uint)fVar246 & uVar114 | ~uVar114 & (uint)fVar196);
      fVar293 = (float)((uint)fVar221 & uVar115 | ~uVar115 & (uint)fVar199);
      fVar224 = (float)((uint)fVar265 & uVar112 | ~uVar112 & (uint)fVar278) - fVar219;
      fVar239 = (float)((uint)fVar279 & uVar113 | ~uVar113 & (uint)fVar287) - fVar342;
      fVar243 = (float)((uint)fVar288 & uVar114 | ~uVar114 & (uint)fVar371) - fVar250;
      fVar247 = (float)((uint)fVar291 & uVar115 | ~uVar115 & (uint)fVar372) - fVar261;
      fVar278 = (float)((uint)fVar263 & uVar112 | ~uVar112 & (uint)fVar223) - fVar292;
      fVar287 = (float)((uint)fVar266 & uVar113 | ~uVar113 & (uint)fVar251) - fVar294;
      fVar371 = (float)((uint)fVar277 & uVar114 | ~uVar114 & (uint)fVar262) - fVar297;
      fVar372 = (float)((uint)fVar178 & uVar115 | ~uVar115 & (uint)fVar264) - fVar298;
      fVar223 = (float)((uint)fVar345 & uVar112 | ~uVar112 & (uint)fVar380) - fVar301;
      fVar251 = (float)((uint)fVar354 & uVar113 | ~uVar113 & (uint)fVar390) - fVar308;
      fVar262 = (float)((uint)fVar196 & uVar114 | ~uVar114 & (uint)fVar246) - fVar310;
      fVar264 = (float)((uint)fVar199 & uVar115 | ~uVar115 & (uint)fVar221) - fVar311;
      fVar299 = fVar219 - fVar382;
      fVar344 = fVar342 - fVar389;
      fVar352 = fVar250 - fVar392;
      fVar357 = fVar261 - fVar394;
      fVar380 = fVar292 - fVar203;
      fVar390 = fVar294 - fVar217;
      fVar246 = fVar297 - fVar220;
      fVar221 = fVar298 - fVar222;
      fVar263 = fVar301 - fVar387;
      fVar266 = fVar308 - fVar289;
      fVar277 = fVar310 - fVar218;
      fVar178 = fVar311 - fVar293;
      fVar265 = (fVar292 * fVar223 - fVar301 * fVar278) * 0.0 +
                (fVar301 * fVar224 - fVar219 * fVar223) * 0.0 +
                (fVar219 * fVar278 - fVar292 * fVar224);
      fVar279 = (fVar294 * fVar251 - fVar308 * fVar287) * 0.0 +
                (fVar308 * fVar239 - fVar342 * fVar251) * 0.0 +
                (fVar342 * fVar287 - fVar294 * fVar239);
      auVar234._4_4_ = fVar279;
      auVar234._0_4_ = fVar265;
      fVar288 = (fVar297 * fVar262 - fVar310 * fVar371) * 0.0 +
                (fVar310 * fVar243 - fVar250 * fVar262) * 0.0 +
                (fVar250 * fVar371 - fVar297 * fVar243);
      fVar291 = (fVar298 * fVar264 - fVar311 * fVar372) * 0.0 +
                (fVar311 * fVar247 - fVar261 * fVar264) * 0.0 +
                (fVar261 * fVar372 - fVar298 * fVar247);
      auVar374._0_4_ =
           (fVar203 * fVar263 - fVar387 * fVar380) * 0.0 +
           (fVar387 * fVar299 - fVar382 * fVar263) * 0.0 + (fVar382 * fVar380 - fVar203 * fVar299);
      auVar374._4_4_ =
           (fVar217 * fVar266 - fVar289 * fVar390) * 0.0 +
           (fVar289 * fVar344 - fVar389 * fVar266) * 0.0 + (fVar389 * fVar390 - fVar217 * fVar344);
      auVar374._8_4_ =
           (fVar220 * fVar277 - fVar218 * fVar246) * 0.0 +
           (fVar218 * fVar352 - fVar392 * fVar277) * 0.0 + (fVar392 * fVar246 - fVar220 * fVar352);
      auVar374._12_4_ =
           (fVar222 * fVar178 - fVar293 * fVar221) * 0.0 +
           (fVar293 * fVar357 - fVar394 * fVar178) * 0.0 + (fVar394 * fVar221 - fVar222 * fVar357);
      auVar234._8_4_ = fVar288;
      auVar234._12_4_ = fVar291;
      auVar140 = maxps(auVar234,auVar374);
      bVar90 = auVar140._0_4_ <= 0.0 && bVar90;
      auVar235._0_4_ = -(uint)bVar90;
      bVar91 = auVar140._4_4_ <= 0.0 && bVar91;
      auVar235._4_4_ = -(uint)bVar91;
      bVar89 = auVar140._8_4_ <= 0.0 && bVar89;
      auVar235._8_4_ = -(uint)bVar89;
      bVar88 = auVar140._12_4_ <= 0.0 && bVar88;
      auVar235._12_4_ = -(uint)bVar88;
      iVar173 = movmskps(iVar173,auVar235);
      if (iVar173 == 0) {
LAB_003aa5f0:
        auVar167._8_8_ = uStack_3a0;
        auVar167._0_8_ = local_3a8;
      }
      else {
        auVar254._0_4_ = fVar263 * fVar278;
        auVar254._4_4_ = fVar266 * fVar287;
        auVar254._8_4_ = fVar277 * fVar371;
        auVar254._12_4_ = fVar178 * fVar372;
        fVar293 = fVar380 * fVar223 - auVar254._0_4_;
        fVar382 = fVar390 * fVar251 - auVar254._4_4_;
        fVar389 = fVar246 * fVar262 - auVar254._8_4_;
        fVar392 = fVar221 * fVar264 - auVar254._12_4_;
        fVar263 = fVar263 * fVar224 - fVar223 * fVar299;
        fVar387 = fVar266 * fVar239 - fVar251 * fVar344;
        fVar289 = fVar277 * fVar243 - fVar262 * fVar352;
        fVar218 = fVar178 * fVar247 - fVar264 * fVar357;
        fVar380 = fVar299 * fVar278 - fVar380 * fVar224;
        fVar287 = fVar344 * fVar287 - fVar390 * fVar239;
        fVar371 = fVar352 * fVar371 - fVar246 * fVar243;
        fVar372 = fVar357 * fVar372 - fVar221 * fVar247;
        auVar272._0_4_ = fVar293 * 0.0 + fVar263 * 0.0 + fVar380;
        auVar272._4_4_ = fVar382 * 0.0 + fVar387 * 0.0 + fVar287;
        auVar272._8_4_ = fVar389 * 0.0 + fVar289 * 0.0 + fVar371;
        auVar272._12_4_ = fVar392 * 0.0 + fVar218 * 0.0 + fVar372;
        auVar140 = rcpps(auVar254,auVar272);
        fVar266 = auVar140._0_4_;
        fVar277 = auVar140._4_4_;
        fVar178 = auVar140._8_4_;
        fVar278 = auVar140._12_4_;
        fVar266 = (1.0 - auVar272._0_4_ * fVar266) * fVar266 + fVar266;
        fVar277 = (1.0 - auVar272._4_4_ * fVar277) * fVar277 + fVar277;
        fVar178 = (1.0 - auVar272._8_4_ * fVar178) * fVar178 + fVar178;
        fVar278 = (1.0 - auVar272._12_4_ * fVar278) * fVar278 + fVar278;
        fVar263 = (fVar301 * fVar380 + fVar292 * fVar263 + fVar219 * fVar293) * fVar266;
        fVar342 = (fVar308 * fVar287 + fVar294 * fVar387 + fVar342 * fVar382) * fVar277;
        aVar348.v[1] = fVar342;
        aVar348.v[0] = fVar263;
        fVar250 = (fVar310 * fVar371 + fVar297 * fVar289 + fVar250 * fVar389) * fVar178;
        fVar261 = (fVar311 * fVar372 + fVar298 * fVar218 + fVar261 * fVar392) * fVar278;
        fVar219 = *(float *)(ray + k * 4 + 0x80);
        bVar90 = (fVar197 <= fVar263 && fVar263 <= fVar219) && bVar90;
        auVar255._0_4_ = -(uint)bVar90;
        bVar91 = (fVar197 <= fVar342 && fVar342 <= fVar219) && bVar91;
        auVar255._4_4_ = -(uint)bVar91;
        bVar89 = (fVar197 <= fVar250 && fVar250 <= fVar219) && bVar89;
        auVar255._8_4_ = -(uint)bVar89;
        bVar88 = (fVar197 <= fVar261 && fVar261 <= fVar219) && bVar88;
        auVar255._12_4_ = -(uint)bVar88;
        iVar173 = movmskps(iVar173,auVar255);
        if (iVar173 == 0) goto LAB_003aa5f0;
        auVar256._0_8_ =
             CONCAT44(-(uint)(auVar272._4_4_ != 0.0 && bVar91),
                      -(uint)(auVar272._0_4_ != 0.0 && bVar90));
        auVar256._8_4_ = -(uint)(auVar272._8_4_ != 0.0 && bVar89);
        auVar256._12_4_ = -(uint)(auVar272._12_4_ != 0.0 && bVar88);
        iVar173 = movmskps(iVar173,auVar256);
        auVar167._8_8_ = uStack_3a0;
        auVar167._0_8_ = local_3a8;
        if (iVar173 != 0) {
          fVar265 = fVar265 * fVar266;
          fVar279 = fVar279 * fVar277;
          fVar288 = fVar288 * fVar178;
          fVar291 = fVar291 * fVar278;
          auVar166._0_4_ = ~uVar112 & (uint)fVar265;
          auVar166._4_4_ = ~uVar113 & (uint)fVar279;
          auVar166._8_4_ = ~uVar114 & (uint)fVar288;
          auVar166._12_4_ = ~uVar115 & (uint)fVar291;
          auVar328._0_4_ = (uint)(1.0 - fVar265) & uVar112;
          auVar328._4_4_ = (uint)(1.0 - fVar279) & uVar113;
          auVar328._8_4_ = (uint)(1.0 - fVar288) & uVar114;
          auVar328._12_4_ = (uint)(1.0 - fVar291) & uVar115;
          aVar329 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar328 | auVar166);
          local_278 = (float)(~uVar112 & (uint)(auVar374._0_4_ * fVar266) |
                             (uint)(1.0 - auVar374._0_4_ * fVar266) & uVar112);
          fStack_274 = (float)(~uVar113 & (uint)(auVar374._4_4_ * fVar277) |
                              (uint)(1.0 - auVar374._4_4_ * fVar277) & uVar113);
          fStack_270 = (float)(~uVar114 & (uint)(auVar374._8_4_ * fVar178) |
                              (uint)(1.0 - auVar374._8_4_ * fVar178) & uVar114);
          fStack_26c = (float)(~uVar115 & (uint)(auVar374._12_4_ * fVar278) |
                              (uint)(1.0 - auVar374._12_4_ * fVar278) & uVar115);
          auVar167._8_4_ = auVar256._8_4_;
          auVar167._0_8_ = auVar256._0_8_;
          auVar167._12_4_ = auVar256._12_4_;
          aVar348.v[2] = fVar250;
          aVar348.v[3] = fVar261;
          aVar346 = aVar348;
        }
      }
      iVar173 = movmskps(iVar173,auVar167);
      if (iVar173 != 0) {
        fVar342 = (auVar165._0_4_ - auVar386._0_4_) * aVar329.v[0] + auVar386._0_4_;
        fVar250 = (auVar165._4_4_ - auVar386._4_4_) * aVar329.v[1] + auVar386._4_4_;
        fVar261 = (auVar165._8_4_ - auVar386._8_4_) * aVar329.v[2] + auVar386._8_4_;
        fVar263 = (auVar165._12_4_ - auVar386._12_4_) * aVar329.v[3] + auVar386._12_4_;
        fVar219 = *(float *)((long)local_350->ray_space + k * 4 + -0x10);
        aVar188._0_4_ = -(uint)(fVar219 * (fVar342 + fVar342) < aVar346.v[0]) & auVar167._0_4_;
        aVar188._4_4_ = -(uint)(fVar219 * (fVar250 + fVar250) < aVar346.v[1]) & auVar167._4_4_;
        aVar188._8_4_ = -(uint)(fVar219 * (fVar261 + fVar261) < aVar346.v[2]) & auVar167._8_4_;
        aVar188._12_4_ = -(uint)(fVar219 * (fVar263 + fVar263) < aVar346.v[3]) & auVar167._12_4_;
        uVar112 = movmskps((int)local_350,(undefined1  [16])aVar188);
        if (uVar112 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
               CONCAT44(fStack_394,local_398);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
               CONCAT44(fVar290,fStack_390);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
               CONCAT44(fVar321,fVar312);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
               CONCAT44(fVar323,fVar322);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
               CONCAT44(fVar358,fVar356);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
               CONCAT44(fVar370,fVar360);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
               CONCAT44(fVar300,fVar355);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
               CONCAT44(fVar309,fVar307);
          pRVar105 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
          bhit.U.field_0 = aVar329;
          bhit.V.field_0.v[0] = local_278;
          bhit.V.field_0.v[1] = fStack_274;
          bhit.V.field_0.v[2] = fStack_270;
          bhit.V.field_0.v[3] = fStack_26c;
          bhit.T.field_0 = aVar346;
          bhit.N = iVar118;
          bhit.valid.field_0 = aVar188;
          if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            pRVar105 = context->args;
            if ((pRVar105->filter != (RTCFilterFunctionN)0x0) ||
               (bVar111 = 1, pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar219 = 1.0 / fVar215;
              bhit.vu.field_0.v[0] = fVar219 * (aVar329.v[0] + 0.0);
              bhit.vu.field_0.v[1] = fVar219 * (aVar329.v[1] + 1.0);
              bhit.vu.field_0.v[2] = fVar219 * (aVar329.v[2] + 2.0);
              bhit.vu.field_0.v[3] = fVar219 * (aVar329.v[3] + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
              bhit.vt.field_0 = aVar346;
              pRVar106 = (RayQueryContext *)(ulong)(uVar112 & 0xff);
              uVar110 = 0;
              if (pRVar106 != (RayQueryContext *)0x0) {
                for (; ((uVar112 & 0xff) >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                }
              }
              local_438 = CONCAT44((undefined4)local_3b0,(undefined4)local_3b0);
              uStack_430._0_4_ = (undefined4)local_3b0;
              uStack_430._4_4_ = (undefined4)local_3b0;
              auVar65 = *(undefined1 (*) [12])*local_358;
              uStack_3dc = (undefined4)((ulong)*(undefined8 *)(*local_358 + 8) >> 0x20);
              while (pRVar106 != (RayQueryContext *)0x0) {
                local_d8 = bhit.vu.field_0.v[uVar110];
                uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_c8 = bhit.vv.field_0.v[uVar110];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar110];
                fVar219 = 1.0 - local_d8;
                fVar250 = local_d8 * fVar219 + local_d8 * fVar219;
                fVar261 = (fVar250 - local_d8 * local_d8) * 3.0;
                fVar342 = local_d8 * local_d8 * 3.0;
                fVar250 = (fVar219 * fVar219 - fVar250) * 3.0;
                args.context = context->user;
                fVar219 = fVar219 * fVar219 * -3.0;
                local_108 = fVar219 * local_398 +
                            fVar250 * fVar312 + fVar261 * fVar356 + fVar342 * fVar355;
                local_f8 = fVar219 * fStack_394 +
                           fVar250 * fVar321 + fVar261 * fVar358 + fVar342 * fVar300;
                local_e8 = fVar219 * fStack_390 +
                           fVar250 * fVar322 + fVar261 * fVar360 + fVar342 * fVar307;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                local_b8 = CONCAT44((uint)uStack_310,(uint)uStack_310);
                uStack_b0 = CONCAT44((uint)uStack_310,(uint)uStack_310);
                local_a8 = local_438;
                uStack_a0 = uStack_430;
                local_98 = (args.context)->instID[0];
                uStack_94 = local_98;
                uStack_90 = local_98;
                uStack_8c = local_98;
                local_88 = (args.context)->instPrimID[0];
                uStack_84 = local_88;
                uStack_80 = local_88;
                uStack_7c = local_88;
                local_3c8._12_4_ = uStack_3dc;
                local_3c8._0_12_ = auVar65;
                args.valid = (int *)local_3c8;
                pRVar105 = (RTCIntersectArguments *)pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_108;
                args.N = 4;
                p_Var102 = pGVar26->occlusionFilterN;
                args.geometryUserPtr = pRVar105;
                args.ray = (RTCRayN *)ray;
                if (p_Var102 != (RTCFilterFunctionN)0x0) {
                  p_Var102 = (RTCFilterFunctionN)(*p_Var102)(&args);
                }
                auVar189._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                auVar189._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                auVar189._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                auVar189._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                uVar112 = movmskps((int)p_Var102,auVar189);
                pRVar103 = (RTCRayN *)(ulong)(uVar112 ^ 0xf);
                if ((uVar112 ^ 0xf) == 0) {
                  auVar189 = auVar189 ^ _DAT_01f46b70;
                }
                else {
                  pRVar105 = context->args;
                  if ((pRVar105->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar105->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*pRVar105->filter)(&args);
                  }
                  auVar168._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar168._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar168._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar168._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  auVar189 = auVar168 ^ _DAT_01f46b70;
                  *(undefined1 (*) [16])(args.ray + 0x80) =
                       ~auVar168 & _DAT_01f45a40 |
                       *(undefined1 (*) [16])(args.ray + 0x80) & auVar168;
                  pRVar103 = args.ray;
                }
                auVar190._0_4_ = auVar189._0_4_ << 0x1f;
                auVar190._4_4_ = auVar189._4_4_ << 0x1f;
                auVar190._8_4_ = auVar189._8_4_ << 0x1f;
                auVar190._12_4_ = auVar189._12_4_ << 0x1f;
                iVar173 = movmskps((int)pRVar103,auVar190);
                if (iVar173 != 0) {
                  bVar111 = 1;
                  goto LAB_003aa5a5;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar108;
                pRVar106 = (RayQueryContext *)((ulong)pRVar106 ^ 1L << (uVar110 & 0x3f));
                uVar110 = 0;
                if (pRVar106 != (RayQueryContext *)0x0) {
                  for (; ((ulong)pRVar106 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                  }
                }
              }
              bVar111 = 0;
            }
            goto LAB_003aa5a5;
          }
        }
      }
      bVar111 = 0;
    }
LAB_003aa5a5:
    uVar108 = SUB84(pRVar105,0);
    if (4 < iVar118) {
      local_58 = iVar118;
      iStack_54 = iVar118;
      iStack_50 = iVar118;
      iStack_4c = iVar118;
      local_78 = 1.0 / fVar215;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      local_68 = (undefined4)local_3b0;
      uStack_64 = (undefined4)local_3b0;
      uStack_60 = (undefined4)local_3b0;
      uStack_5c = (undefined4)local_3b0;
      local_318 = CONCAT44((uint)uStack_310,(uint)uStack_310);
      uStack_310._4_4_ = (uint)uStack_310;
      for (lVar107 = 4; uVar108 = SUB84(pRVar105,0), lVar107 < iVar118; lVar107 = lVar107 + 4) {
        uVar113 = (uint)lVar107;
        pRVar105 = (RTCIntersectArguments *)(bezier_basis0 + lVar104);
        pRVar8 = &pRVar105->flags + lVar107;
        fVar215 = (float)*pRVar8;
        fVar219 = (float)pRVar8[1];
        fVar342 = (float)pRVar8[2];
        fVar250 = (float)pRVar8[3];
        pfVar1 = (float *)(lVar104 + 0x21fb768 + lVar107 * 4);
        fVar261 = *pfVar1;
        fVar263 = pfVar1[1];
        fVar266 = pfVar1[2];
        fVar277 = pfVar1[3];
        pfVar1 = (float *)(lVar104 + 0x21fbbec + lVar107 * 4);
        fVar178 = *pfVar1;
        fVar278 = pfVar1[1];
        fVar287 = pfVar1[2];
        fVar371 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar104 + 0x21fc070 + lVar107 * 4);
        fVar372 = *(float *)*pauVar9;
        fVar380 = *(float *)(*pauVar9 + 4);
        fVar387 = *(float *)(*pauVar9 + 8);
        auVar65 = *pauVar9;
        fVar390 = *(float *)pauVar9[1];
        fVar292 = fVar296 * fVar215 + fVar343 * fVar261 + fVar341 * fVar178 + fVar202 * fVar372;
        fVar294 = fVar296 * fVar219 + fVar343 * fVar263 + fVar341 * fVar278 + fVar202 * fVar380;
        fVar297 = fVar296 * fVar342 + fVar343 * fVar266 + fVar341 * fVar287 + fVar202 * fVar387;
        fVar298 = fVar296 * fVar250 + fVar343 * fVar277 + fVar341 * fVar371 + fVar202 * fVar390;
        fVar299 = fVar350 * fVar215 + fVar351 * fVar261 + local_368 * fVar178 + fVar216 * fVar372;
        fVar352 = fVar350 * fVar219 + fVar351 * fVar263 + fStack_364 * fVar278 + fVar216 * fVar380;
        fVar359 = fVar350 * fVar342 + fVar351 * fVar266 + fStack_360 * fVar287 + fVar216 * fVar387;
        fVar353 = fVar350 * fVar250 + fVar351 * fVar277 + fStack_35c * fVar371 + fVar216 * fVar390;
        auVar192._0_4_ =
             fVar290 * fVar215 + fVar323 * fVar261 + fVar370 * fVar178 + fVar309 * fVar372;
        auVar192._4_4_ =
             fVar290 * fVar219 + fVar323 * fVar263 + fVar370 * fVar278 + fVar309 * fVar380;
        auVar192._8_4_ =
             fVar290 * fVar342 + fVar323 * fVar266 + fVar370 * fVar287 + fVar309 * fVar387;
        auVar192._12_4_ =
             fVar290 * fVar250 + fVar323 * fVar277 + fVar370 * fVar371 + fVar309 * fVar390;
        pfVar1 = (float *)(bezier_basis1 + lVar104 + lVar107 * 4);
        fVar372 = *pfVar1;
        fVar380 = pfVar1[1];
        fVar387 = pfVar1[2];
        fVar289 = pfVar1[3];
        pfVar1 = (float *)(lVar104 + 0x21fdb88 + lVar107 * 4);
        fVar246 = *pfVar1;
        fVar218 = pfVar1[1];
        fVar221 = pfVar1[2];
        fVar293 = pfVar1[3];
        pfVar1 = (float *)(lVar104 + 0x21fe00c + lVar107 * 4);
        fVar301 = *pfVar1;
        fVar308 = pfVar1[1];
        fVar310 = pfVar1[2];
        fVar311 = pfVar1[3];
        pfVar1 = (float *)(lVar104 + 0x21fe490 + lVar107 * 4);
        fVar382 = *pfVar1;
        fVar389 = pfVar1[1];
        fVar392 = pfVar1[2];
        fVar394 = pfVar1[3];
        fVar223 = fVar296 * fVar372 + fVar343 * fVar246 + fVar341 * fVar301 + fVar202 * fVar382;
        fVar239 = fVar296 * fVar380 + fVar343 * fVar218 + fVar341 * fVar308 + fVar202 * fVar389;
        fVar247 = fVar296 * fVar387 + fVar343 * fVar221 + fVar341 * fVar310 + fVar202 * fVar392;
        fVar262 = fVar296 * fVar289 + fVar343 * fVar293 + fVar341 * fVar311 + fVar202 * fVar394;
        fVar265 = fVar350 * fVar372 + fVar351 * fVar246 + local_368 * fVar301 + fVar216 * fVar382;
        fVar279 = fVar350 * fVar380 + fVar351 * fVar218 + fStack_364 * fVar308 + fVar216 * fVar389;
        fVar288 = fVar350 * fVar387 + fVar351 * fVar221 + fStack_360 * fVar310 + fVar216 * fVar392;
        fVar291 = fVar350 * fVar289 + fVar351 * fVar293 + fStack_35c * fVar311 + fVar216 * fVar394;
        auVar375._0_4_ =
             fVar290 * fVar372 + fVar323 * fVar246 + fVar370 * fVar301 + fVar309 * fVar382;
        auVar375._4_4_ =
             fVar290 * fVar380 + fVar323 * fVar218 + fVar370 * fVar308 + fVar309 * fVar389;
        auVar375._8_4_ =
             fVar290 * fVar387 + fVar323 * fVar221 + fVar370 * fVar310 + fVar309 * fVar392;
        auVar375._12_4_ =
             fVar290 * fVar289 + fVar323 * fVar293 + fVar370 * fVar311 + fVar309 * fVar394;
        fVar224 = fVar223 - fVar292;
        fVar243 = fVar239 - fVar294;
        fVar251 = fVar247 - fVar297;
        fVar264 = fVar262 - fVar298;
        fVar203 = fVar265 - fVar299;
        fVar217 = fVar279 - fVar352;
        fVar220 = fVar288 - fVar359;
        fVar222 = fVar291 - fVar353;
        fVar344 = fVar299 * fVar224 - fVar292 * fVar203;
        fVar357 = fVar352 * fVar243 - fVar294 * fVar217;
        fVar345 = fVar359 * fVar251 - fVar297 * fVar220;
        fVar354 = fVar353 * fVar264 - fVar298 * fVar222;
        auVar140 = maxps(auVar192,auVar375);
        bVar88 = fVar344 * fVar344 <=
                 auVar140._0_4_ * auVar140._0_4_ * (fVar224 * fVar224 + fVar203 * fVar203) &&
                 (int)uVar113 < local_58;
        auVar295._0_4_ = -(uint)bVar88;
        bVar89 = fVar357 * fVar357 <=
                 auVar140._4_4_ * auVar140._4_4_ * (fVar243 * fVar243 + fVar217 * fVar217) &&
                 (int)(uVar113 | 1) < iStack_54;
        auVar295._4_4_ = -(uint)bVar89;
        bVar90 = fVar345 * fVar345 <=
                 auVar140._8_4_ * auVar140._8_4_ * (fVar251 * fVar251 + fVar220 * fVar220) &&
                 (int)(uVar113 | 2) < iStack_50;
        auVar295._8_4_ = -(uint)bVar90;
        bVar91 = fVar354 * fVar354 <=
                 auVar140._12_4_ * auVar140._12_4_ * (fVar264 * fVar264 + fVar222 * fVar222) &&
                 (int)(uVar113 | 3) < iStack_4c;
        auVar295._12_4_ = -(uint)bVar91;
        uVar112 = movmskps((int)pRVar106,auVar295);
        pRVar106 = (RayQueryContext *)(ulong)uVar112;
        if (uVar112 != 0) {
          fVar354 = fVar382 * fVar201 + fVar301 * local_388 + fVar246 * local_378 +
                    fVar372 * fVar330;
          fVar180 = fVar389 * fVar201 + fVar308 * fStack_384 + fVar218 * fStack_374 +
                    fVar380 * fVar330;
          fVar196 = fVar392 * fVar201 + fVar310 * fStack_380 + fVar221 * fStack_370 +
                    fVar387 * fVar330;
          fVar198 = fVar394 * fVar201 + fVar311 * fStack_37c + fVar293 * fStack_36c +
                    fVar289 * fVar330;
          local_3f8 = auVar65._0_4_;
          fStack_3f4 = auVar65._4_4_;
          fStack_3f0 = auVar65._8_4_;
          fVar241 = local_3f8 * fVar201 + fVar178 * local_388 + fVar261 * local_378 +
                    fVar215 * fVar330;
          fVar244 = fStack_3f4 * fVar201 + fVar278 * fStack_384 + fVar263 * fStack_374 +
                    fVar219 * fVar330;
          fVar245 = fStack_3f0 * fVar201 + fVar287 * fStack_380 + fVar266 * fStack_370 +
                    fVar342 * fVar330;
          fVar248 = fVar390 * fVar201 + fVar371 * fStack_37c + fVar277 * fStack_36c +
                    fVar250 * fVar330;
          pfVar1 = (float *)(lVar104 + 0x21fc4f4 + lVar107 * 4);
          fVar215 = *pfVar1;
          fVar219 = pfVar1[1];
          fVar342 = pfVar1[2];
          fVar250 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21fc978 + lVar107 * 4);
          fVar261 = *pfVar1;
          fVar263 = pfVar1[1];
          fVar266 = pfVar1[2];
          fVar277 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21fcdfc + lVar107 * 4);
          fVar178 = *pfVar1;
          fVar278 = pfVar1[1];
          fVar287 = pfVar1[2];
          fVar371 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21fd280 + lVar107 * 4);
          fVar372 = *pfVar1;
          fVar380 = pfVar1[1];
          fVar387 = pfVar1[2];
          fVar390 = pfVar1[3];
          fVar333 = fVar296 * fVar215 + fVar343 * fVar261 + fVar341 * fVar178 + fVar202 * fVar372;
          fVar373 = fVar296 * fVar219 + fVar343 * fVar263 + fVar341 * fVar278 + fVar202 * fVar380;
          fVar377 = fVar296 * fVar342 + fVar343 * fVar266 + fVar341 * fVar287 + fVar202 * fVar387;
          fVar378 = fVar296 * fVar250 + fVar343 * fVar277 + fVar341 * fVar371 + fVar202 * fVar390;
          fVar199 = fVar350 * fVar215 + fVar351 * fVar261 + local_368 * fVar178 + fVar216 * fVar372;
          fVar225 = fVar350 * fVar219 + fVar351 * fVar263 + fStack_364 * fVar278 + fVar216 * fVar380
          ;
          fVar226 = fVar350 * fVar342 + fVar351 * fVar266 + fStack_360 * fVar287 + fVar216 * fVar387
          ;
          fVar240 = fVar350 * fVar250 + fVar351 * fVar277 + fStack_35c * fVar371 + fVar216 * fVar390
          ;
          pfVar1 = (float *)(lVar104 + 0x21fe914 + lVar107 * 4);
          fVar289 = *pfVar1;
          fVar246 = pfVar1[1];
          fVar218 = pfVar1[2];
          fVar221 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21ff21c + lVar107 * 4);
          fVar293 = *pfVar1;
          fVar301 = pfVar1[1];
          fVar308 = pfVar1[2];
          fVar310 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21ff6a0 + lVar107 * 4);
          fVar311 = *pfVar1;
          fVar382 = pfVar1[1];
          fVar389 = pfVar1[2];
          fVar392 = pfVar1[3];
          pfVar1 = (float *)(lVar104 + 0x21fed98 + lVar107 * 4);
          fVar394 = *pfVar1;
          fVar344 = pfVar1[1];
          fVar357 = pfVar1[2];
          fVar345 = pfVar1[3];
          fVar379 = fVar296 * fVar289 + fVar343 * fVar394 + fVar341 * fVar293 + fVar202 * fVar311;
          fVar381 = fVar296 * fVar246 + fVar343 * fVar344 + fVar341 * fVar301 + fVar202 * fVar382;
          fVar388 = fVar296 * fVar218 + fVar343 * fVar357 + fVar341 * fVar308 + fVar202 * fVar389;
          fVar391 = fVar296 * fVar221 + fVar343 * fVar345 + fVar341 * fVar310 + fVar202 * fVar392;
          fVar249 = fVar350 * fVar289 + fVar351 * fVar394 + local_368 * fVar293 + fVar216 * fVar311;
          fVar324 = fVar350 * fVar246 + fVar351 * fVar344 + fStack_364 * fVar301 + fVar216 * fVar382
          ;
          fVar331 = fVar350 * fVar218 + fVar351 * fVar357 + fStack_360 * fVar308 + fVar216 * fVar389
          ;
          fVar332 = fVar350 * fVar221 + fVar351 * fVar345 + fStack_35c * fVar310 + fVar216 * fVar392
          ;
          auVar349._0_8_ = CONCAT44(fVar373,fVar333) & 0x7fffffff7fffffff;
          auVar349._8_4_ = ABS(fVar377);
          auVar349._12_4_ = ABS(fVar378);
          auVar273._0_8_ = CONCAT44(fVar225,fVar199) & 0x7fffffff7fffffff;
          auVar273._8_4_ = ABS(fVar226);
          auVar273._12_4_ = ABS(fVar240);
          auVar140 = maxps(auVar349,auVar273);
          auVar368._0_8_ =
               CONCAT44(fVar219 * fVar330 +
                        fVar263 * fStack_374 + fVar278 * fStack_384 + fVar380 * fVar201,
                        fVar215 * fVar330 +
                        fVar261 * local_378 + fVar178 * local_388 + fVar372 * fVar201) &
               0x7fffffff7fffffff;
          auVar368._8_4_ =
               ABS(fVar342 * fVar330 +
                   fVar266 * fStack_370 + fVar287 * fStack_380 + fVar387 * fVar201);
          auVar368._12_4_ =
               ABS(fVar250 * fVar330 +
                   fVar277 * fStack_36c + fVar371 * fStack_37c + fVar390 * fVar201);
          auVar140 = maxps(auVar140,auVar368);
          uVar112 = -(uint)(local_418 <= auVar140._0_4_);
          uVar114 = -(uint)(local_418 <= auVar140._4_4_);
          uVar115 = -(uint)(local_418 <= auVar140._8_4_);
          uVar116 = -(uint)(local_418 <= auVar140._12_4_);
          auVar274._0_4_ = ~uVar112 & (uint)fVar224;
          auVar274._4_4_ = ~uVar114 & (uint)fVar243;
          auVar274._8_4_ = ~uVar115 & (uint)fVar251;
          auVar274._12_4_ = ~uVar116 & (uint)fVar264;
          auVar339._0_4_ = (uint)fVar333 & uVar112;
          auVar339._4_4_ = (uint)fVar373 & uVar114;
          auVar339._8_4_ = (uint)fVar377 & uVar115;
          auVar339._12_4_ = (uint)fVar378 & uVar116;
          auVar339 = auVar339 | auVar274;
          fVar199 = (float)(~uVar112 & (uint)fVar203 | (uint)fVar199 & uVar112);
          fVar225 = (float)(~uVar114 & (uint)fVar217 | (uint)fVar225 & uVar114);
          fVar226 = (float)(~uVar115 & (uint)fVar220 | (uint)fVar226 & uVar115);
          fVar240 = (float)(~uVar116 & (uint)fVar222 | (uint)fVar240 & uVar116);
          auVar369._0_8_ = CONCAT44(fVar381,fVar379) & 0x7fffffff7fffffff;
          auVar369._8_4_ = ABS(fVar388);
          auVar369._12_4_ = ABS(fVar391);
          auVar211._0_8_ = CONCAT44(fVar324,fVar249) & 0x7fffffff7fffffff;
          auVar211._8_4_ = ABS(fVar331);
          auVar211._12_4_ = ABS(fVar332);
          auVar140 = maxps(auVar369,auVar211);
          auVar169._0_8_ =
               CONCAT44(fVar246 * fVar330 +
                        fVar344 * fStack_374 + fVar301 * fStack_384 + fVar382 * fVar201,
                        fVar289 * fVar330 +
                        fVar394 * local_378 + fVar293 * local_388 + fVar311 * fVar201) &
               0x7fffffff7fffffff;
          auVar169._8_4_ =
               ABS(fVar218 * fVar330 +
                   fVar357 * fStack_370 + fVar308 * fStack_380 + fVar389 * fVar201);
          auVar169._12_4_ =
               ABS(fVar221 * fVar330 +
                   fVar345 * fStack_36c + fVar310 * fStack_37c + fVar392 * fVar201);
          auVar140 = maxps(auVar140,auVar169);
          uVar112 = -(uint)(local_418 <= auVar140._0_4_);
          uVar114 = -(uint)(local_418 <= auVar140._4_4_);
          uVar115 = -(uint)(local_418 <= auVar140._8_4_);
          uVar116 = -(uint)(local_418 <= auVar140._12_4_);
          fVar311 = (float)((uint)fVar379 & uVar112 | ~uVar112 & (uint)fVar224);
          fVar389 = (float)((uint)fVar381 & uVar114 | ~uVar114 & (uint)fVar243);
          fVar394 = (float)((uint)fVar388 & uVar115 | ~uVar115 & (uint)fVar251);
          fVar357 = (float)((uint)fVar391 & uVar116 | ~uVar116 & (uint)fVar264);
          fVar289 = (float)(~uVar112 & (uint)fVar203 | (uint)fVar249 & uVar112);
          fVar218 = (float)(~uVar114 & (uint)fVar217 | (uint)fVar324 & uVar114);
          fVar293 = (float)(~uVar115 & (uint)fVar220 | (uint)fVar331 & uVar115);
          fVar308 = (float)(~uVar116 & (uint)fVar222 | (uint)fVar332 & uVar116);
          fVar277 = auVar339._0_4_;
          fVar215 = auVar339._4_4_;
          fVar219 = auVar339._8_4_;
          fVar342 = auVar339._12_4_;
          auVar257._0_4_ = fVar199 * fVar199 + fVar277 * fVar277;
          auVar257._4_4_ = fVar225 * fVar225 + fVar215 * fVar215;
          auVar257._8_4_ = fVar226 * fVar226 + fVar219 * fVar219;
          auVar257._12_4_ = fVar240 * fVar240 + fVar342 * fVar342;
          auVar140 = rsqrtps(auVar274,auVar257);
          fVar250 = auVar140._0_4_;
          fVar261 = auVar140._4_4_;
          fVar263 = auVar140._8_4_;
          fVar266 = auVar140._12_4_;
          auVar275._0_4_ = fVar250 * fVar250 * auVar257._0_4_ * 0.5 * fVar250;
          auVar275._4_4_ = fVar261 * fVar261 * auVar257._4_4_ * 0.5 * fVar261;
          auVar275._8_4_ = fVar263 * fVar263 * auVar257._8_4_ * 0.5 * fVar263;
          auVar275._12_4_ = fVar266 * fVar266 * auVar257._12_4_ * 0.5 * fVar266;
          fVar372 = fVar250 * 1.5 - auVar275._0_4_;
          fVar380 = fVar261 * 1.5 - auVar275._4_4_;
          fVar387 = fVar263 * 1.5 - auVar275._8_4_;
          fVar390 = fVar266 * 1.5 - auVar275._12_4_;
          auVar258._0_4_ = fVar289 * fVar289 + fVar311 * fVar311;
          auVar258._4_4_ = fVar218 * fVar218 + fVar389 * fVar389;
          auVar258._8_4_ = fVar293 * fVar293 + fVar394 * fVar394;
          auVar258._12_4_ = fVar308 * fVar308 + fVar357 * fVar357;
          auVar140 = rsqrtps(auVar275,auVar258);
          fVar250 = auVar140._0_4_;
          fVar261 = auVar140._4_4_;
          fVar263 = auVar140._8_4_;
          fVar266 = auVar140._12_4_;
          fVar178 = fVar250 * 1.5 - fVar250 * fVar250 * auVar258._0_4_ * 0.5 * fVar250;
          fVar278 = fVar261 * 1.5 - fVar261 * fVar261 * auVar258._4_4_ * 0.5 * fVar261;
          fVar287 = fVar263 * 1.5 - fVar263 * fVar263 * auVar258._8_4_ * 0.5 * fVar263;
          fVar371 = fVar266 * 1.5 - fVar266 * fVar266 * auVar258._12_4_ * 0.5 * fVar266;
          fVar382 = fVar199 * fVar372 * auVar192._0_4_;
          fVar392 = fVar225 * fVar380 * auVar192._4_4_;
          fVar203 = fVar226 * fVar387 * auVar192._8_4_;
          fVar220 = fVar240 * fVar390 * auVar192._12_4_;
          fVar261 = -fVar277 * fVar372 * auVar192._0_4_;
          fVar263 = -fVar215 * fVar380 * auVar192._4_4_;
          fVar266 = -fVar219 * fVar387 * auVar192._8_4_;
          fVar277 = -fVar342 * fVar390 * auVar192._12_4_;
          fVar246 = fVar372 * 0.0 * auVar192._0_4_;
          fVar221 = fVar380 * 0.0 * auVar192._4_4_;
          fVar301 = fVar387 * 0.0 * auVar192._8_4_;
          fVar310 = fVar390 * 0.0 * auVar192._12_4_;
          fVar222 = fVar289 * fVar178 * auVar375._0_4_;
          fVar224 = fVar218 * fVar278 * auVar375._4_4_;
          fVar331 = fVar293 * fVar287 * auVar375._8_4_;
          fVar332 = fVar308 * fVar371 * auVar375._12_4_;
          fVar243 = fVar223 + fVar222;
          fVar251 = fVar239 + fVar224;
          fVar264 = fVar247 + fVar331;
          fVar344 = fVar262 + fVar332;
          fVar215 = -fVar311 * fVar178 * auVar375._0_4_;
          fVar219 = -fVar389 * fVar278 * auVar375._4_4_;
          fVar342 = -fVar394 * fVar287 * auVar375._8_4_;
          fVar250 = -fVar357 * fVar371 * auVar375._12_4_;
          fVar357 = fVar265 + fVar215;
          fVar345 = fVar279 + fVar219;
          fVar199 = fVar288 + fVar342;
          fVar225 = fVar291 + fVar250;
          fVar372 = fVar178 * 0.0 * auVar375._0_4_;
          fVar380 = fVar278 * 0.0 * auVar375._4_4_;
          fVar387 = fVar287 * 0.0 * auVar375._8_4_;
          fVar390 = fVar371 * 0.0 * auVar375._12_4_;
          fVar289 = fVar292 - fVar382;
          fVar218 = fVar294 - fVar392;
          fVar293 = fVar297 - fVar203;
          fVar308 = fVar298 - fVar220;
          fVar226 = fVar354 + fVar372;
          fVar240 = fVar180 + fVar380;
          fVar249 = fVar196 + fVar387;
          fVar324 = fVar198 + fVar390;
          fVar311 = fVar299 - fVar261;
          fVar389 = fVar352 - fVar263;
          fVar394 = fVar359 - fVar266;
          fVar217 = fVar353 - fVar277;
          fVar178 = fVar241 - fVar246;
          fVar278 = fVar244 - fVar221;
          fVar287 = fVar245 - fVar301;
          fVar371 = fVar248 - fVar310;
          uVar112 = -(uint)(0.0 < (fVar311 * (fVar226 - fVar178) - fVar178 * (fVar357 - fVar311)) *
                                  0.0 + (fVar178 * (fVar243 - fVar289) -
                                        (fVar226 - fVar178) * fVar289) * 0.0 +
                                        ((fVar357 - fVar311) * fVar289 -
                                        (fVar243 - fVar289) * fVar311));
          uVar114 = -(uint)(0.0 < (fVar389 * (fVar240 - fVar278) - fVar278 * (fVar345 - fVar389)) *
                                  0.0 + (fVar278 * (fVar251 - fVar218) -
                                        (fVar240 - fVar278) * fVar218) * 0.0 +
                                        ((fVar345 - fVar389) * fVar218 -
                                        (fVar251 - fVar218) * fVar389));
          uVar115 = -(uint)(0.0 < (fVar394 * (fVar249 - fVar287) - fVar287 * (fVar199 - fVar394)) *
                                  0.0 + (fVar287 * (fVar264 - fVar293) -
                                        (fVar249 - fVar287) * fVar293) * 0.0 +
                                        ((fVar199 - fVar394) * fVar293 -
                                        (fVar264 - fVar293) * fVar394));
          uVar116 = -(uint)(0.0 < (fVar217 * (fVar324 - fVar371) - fVar371 * (fVar225 - fVar217)) *
                                  0.0 + (fVar371 * (fVar344 - fVar308) -
                                        (fVar324 - fVar371) * fVar308) * 0.0 +
                                        ((fVar225 - fVar217) * fVar308 -
                                        (fVar344 - fVar308) * fVar217));
          fVar222 = (float)((uint)(fVar223 - fVar222) & uVar112 |
                           ~uVar112 & (uint)(fVar292 + fVar382));
          fVar223 = (float)((uint)(fVar239 - fVar224) & uVar114 |
                           ~uVar114 & (uint)(fVar294 + fVar392));
          fVar224 = (float)((uint)(fVar247 - fVar331) & uVar115 |
                           ~uVar115 & (uint)(fVar297 + fVar203));
          fVar239 = (float)((uint)(fVar262 - fVar332) & uVar116 |
                           ~uVar116 & (uint)(fVar298 + fVar220));
          fVar292 = (float)((uint)(fVar265 - fVar215) & uVar112 |
                           ~uVar112 & (uint)(fVar299 + fVar261));
          fVar294 = (float)((uint)(fVar279 - fVar219) & uVar114 |
                           ~uVar114 & (uint)(fVar352 + fVar263));
          fVar297 = (float)((uint)(fVar288 - fVar342) & uVar115 |
                           ~uVar115 & (uint)(fVar359 + fVar266));
          fVar291 = (float)((uint)(fVar291 - fVar250) & uVar116 |
                           ~uVar116 & (uint)(fVar353 + fVar277));
          fVar261 = (float)((uint)(fVar354 - fVar372) & uVar112 |
                           ~uVar112 & (uint)(fVar241 + fVar246));
          fVar263 = (float)((uint)(fVar180 - fVar380) & uVar114 |
                           ~uVar114 & (uint)(fVar244 + fVar221));
          fVar266 = (float)((uint)(fVar196 - fVar387) & uVar115 |
                           ~uVar115 & (uint)(fVar245 + fVar301));
          fVar277 = (float)((uint)(fVar198 - fVar390) & uVar116 |
                           ~uVar116 & (uint)(fVar248 + fVar310));
          fVar246 = (float)((uint)fVar289 & uVar112 | ~uVar112 & (uint)fVar243);
          fVar221 = (float)((uint)fVar218 & uVar114 | ~uVar114 & (uint)fVar251);
          fVar301 = (float)((uint)fVar293 & uVar115 | ~uVar115 & (uint)fVar264);
          fVar310 = (float)((uint)fVar308 & uVar116 | ~uVar116 & (uint)fVar344);
          fVar382 = (float)((uint)fVar311 & uVar112 | ~uVar112 & (uint)fVar357);
          fVar392 = (float)((uint)fVar389 & uVar114 | ~uVar114 & (uint)fVar345);
          fVar203 = (float)((uint)fVar394 & uVar115 | ~uVar115 & (uint)fVar199);
          fVar220 = (float)((uint)fVar217 & uVar116 | ~uVar116 & (uint)fVar225);
          fVar372 = (float)((uint)fVar178 & uVar112 | ~uVar112 & (uint)fVar226);
          fVar380 = (float)((uint)fVar278 & uVar114 | ~uVar114 & (uint)fVar240);
          fVar387 = (float)((uint)fVar287 & uVar115 | ~uVar115 & (uint)fVar249);
          fVar390 = (float)((uint)fVar371 & uVar116 | ~uVar116 & (uint)fVar324);
          fVar289 = (float)((uint)fVar243 & uVar112 | ~uVar112 & (uint)fVar289) - fVar222;
          fVar218 = (float)((uint)fVar251 & uVar114 | ~uVar114 & (uint)fVar218) - fVar223;
          fVar293 = (float)((uint)fVar264 & uVar115 | ~uVar115 & (uint)fVar293) - fVar224;
          fVar308 = (float)((uint)fVar344 & uVar116 | ~uVar116 & (uint)fVar308) - fVar239;
          fVar311 = (float)((uint)fVar357 & uVar112 | ~uVar112 & (uint)fVar311) - fVar292;
          fVar389 = (float)((uint)fVar345 & uVar114 | ~uVar114 & (uint)fVar389) - fVar294;
          fVar394 = (float)((uint)fVar199 & uVar115 | ~uVar115 & (uint)fVar394) - fVar297;
          fVar217 = (float)((uint)fVar225 & uVar116 | ~uVar116 & (uint)fVar217) - fVar291;
          fVar243 = (float)((uint)fVar226 & uVar112 | ~uVar112 & (uint)fVar178) - fVar261;
          fVar247 = (float)((uint)fVar240 & uVar114 | ~uVar114 & (uint)fVar278) - fVar263;
          fVar251 = (float)((uint)fVar249 & uVar115 | ~uVar115 & (uint)fVar287) - fVar266;
          fVar262 = (float)((uint)fVar324 & uVar116 | ~uVar116 & (uint)fVar371) - fVar277;
          fVar298 = fVar222 - fVar246;
          fVar299 = fVar223 - fVar221;
          fVar344 = fVar224 - fVar301;
          fVar352 = fVar239 - fVar310;
          fVar215 = fVar292 - fVar382;
          fVar219 = fVar294 - fVar392;
          fVar342 = fVar297 - fVar203;
          fVar250 = fVar291 - fVar220;
          fVar178 = fVar261 - fVar372;
          fVar278 = fVar263 - fVar380;
          fVar287 = fVar266 - fVar387;
          fVar371 = fVar277 - fVar390;
          fVar264 = (fVar292 * fVar243 - fVar261 * fVar311) * 0.0 +
                    (fVar261 * fVar289 - fVar222 * fVar243) * 0.0 +
                    (fVar222 * fVar311 - fVar292 * fVar289);
          fVar265 = (fVar294 * fVar247 - fVar263 * fVar389) * 0.0 +
                    (fVar263 * fVar218 - fVar223 * fVar247) * 0.0 +
                    (fVar223 * fVar389 - fVar294 * fVar218);
          auVar236._4_4_ = fVar265;
          auVar236._0_4_ = fVar264;
          fVar279 = (fVar297 * fVar251 - fVar266 * fVar394) * 0.0 +
                    (fVar266 * fVar293 - fVar224 * fVar251) * 0.0 +
                    (fVar224 * fVar394 - fVar297 * fVar293);
          fVar288 = (fVar291 * fVar262 - fVar277 * fVar217) * 0.0 +
                    (fVar277 * fVar308 - fVar239 * fVar262) * 0.0 +
                    (fVar239 * fVar217 - fVar291 * fVar308);
          auVar376._0_4_ =
               (fVar382 * fVar178 - fVar372 * fVar215) * 0.0 +
               (fVar372 * fVar298 - fVar246 * fVar178) * 0.0 +
               (fVar246 * fVar215 - fVar382 * fVar298);
          auVar376._4_4_ =
               (fVar392 * fVar278 - fVar380 * fVar219) * 0.0 +
               (fVar380 * fVar299 - fVar221 * fVar278) * 0.0 +
               (fVar221 * fVar219 - fVar392 * fVar299);
          auVar376._8_4_ =
               (fVar203 * fVar287 - fVar387 * fVar342) * 0.0 +
               (fVar387 * fVar344 - fVar301 * fVar287) * 0.0 +
               (fVar301 * fVar342 - fVar203 * fVar344);
          auVar376._12_4_ =
               (fVar220 * fVar371 - fVar390 * fVar250) * 0.0 +
               (fVar390 * fVar352 - fVar310 * fVar371) * 0.0 +
               (fVar310 * fVar250 - fVar220 * fVar352);
          auVar236._8_4_ = fVar279;
          auVar236._12_4_ = fVar288;
          auVar140 = maxps(auVar236,auVar376);
          bVar88 = auVar140._0_4_ <= 0.0 && bVar88;
          auVar237._0_4_ = -(uint)bVar88;
          bVar89 = auVar140._4_4_ <= 0.0 && bVar89;
          auVar237._4_4_ = -(uint)bVar89;
          bVar90 = auVar140._8_4_ <= 0.0 && bVar90;
          auVar237._8_4_ = -(uint)bVar90;
          bVar91 = auVar140._12_4_ <= 0.0 && bVar91;
          auVar237._12_4_ = -(uint)bVar91;
          iVar173 = movmskps((int)(bezier_basis1 + lVar104),auVar237);
          if (iVar173 == 0) {
LAB_003ab483:
            auVar213._8_8_ = uStack_3a0;
            auVar213._0_8_ = local_3a8;
          }
          else {
            fVar380 = fVar215 * fVar243 - fVar178 * fVar311;
            fVar387 = fVar219 * fVar247 - fVar278 * fVar389;
            fVar390 = fVar342 * fVar251 - fVar287 * fVar394;
            fVar246 = fVar250 * fVar262 - fVar371 * fVar217;
            fVar372 = fVar178 * fVar289 - fVar243 * fVar298;
            fVar278 = fVar278 * fVar218 - fVar247 * fVar299;
            fVar287 = fVar287 * fVar293 - fVar251 * fVar344;
            fVar371 = fVar371 * fVar308 - fVar262 * fVar352;
            fVar215 = fVar298 * fVar311 - fVar215 * fVar289;
            fVar289 = fVar299 * fVar389 - fVar219 * fVar218;
            fVar218 = fVar344 * fVar394 - fVar342 * fVar293;
            fVar221 = fVar352 * fVar217 - fVar250 * fVar308;
            auVar212._0_4_ = fVar372 * 0.0 + fVar215;
            auVar212._4_4_ = fVar278 * 0.0 + fVar289;
            auVar212._8_4_ = fVar287 * 0.0 + fVar218;
            auVar212._12_4_ = fVar371 * 0.0 + fVar221;
            auVar286._0_4_ = fVar380 * 0.0 + auVar212._0_4_;
            auVar286._4_4_ = fVar387 * 0.0 + auVar212._4_4_;
            auVar286._8_4_ = fVar390 * 0.0 + auVar212._8_4_;
            auVar286._12_4_ = fVar246 * 0.0 + auVar212._12_4_;
            auVar140 = rcpps(auVar212,auVar286);
            fVar219 = auVar140._0_4_;
            fVar342 = auVar140._4_4_;
            fVar250 = auVar140._8_4_;
            fVar178 = auVar140._12_4_;
            fVar219 = (1.0 - auVar286._0_4_ * fVar219) * fVar219 + fVar219;
            fVar342 = (1.0 - auVar286._4_4_ * fVar342) * fVar342 + fVar342;
            fVar250 = (1.0 - auVar286._8_4_ * fVar250) * fVar250 + fVar250;
            fVar178 = (1.0 - auVar286._12_4_ * fVar178) * fVar178 + fVar178;
            fVar261 = (fVar261 * fVar215 + fVar292 * fVar372 + fVar222 * fVar380) * fVar219;
            fVar263 = (fVar263 * fVar289 + fVar294 * fVar278 + fVar223 * fVar387) * fVar342;
            aVar340.v[1] = fVar263;
            aVar340.v[0] = fVar261;
            fVar266 = (fVar266 * fVar218 + fVar297 * fVar287 + fVar224 * fVar390) * fVar250;
            fVar277 = (fVar277 * fVar221 + fVar291 * fVar371 + fVar239 * fVar246) * fVar178;
            fVar215 = *(float *)(ray + k * 4 + 0x80);
            bVar88 = (fVar197 <= fVar261 && fVar261 <= fVar215) && bVar88;
            auVar259._0_4_ = -(uint)bVar88;
            bVar89 = (fVar197 <= fVar263 && fVar263 <= fVar215) && bVar89;
            auVar259._4_4_ = -(uint)bVar89;
            bVar90 = (fVar197 <= fVar266 && fVar266 <= fVar215) && bVar90;
            auVar259._8_4_ = -(uint)bVar90;
            bVar91 = (fVar197 <= fVar277 && fVar277 <= fVar215) && bVar91;
            auVar259._12_4_ = -(uint)bVar91;
            iVar173 = movmskps(iVar173,auVar259);
            if (iVar173 == 0) goto LAB_003ab483;
            auVar260._0_8_ =
                 CONCAT44(-(uint)(auVar286._4_4_ != 0.0 && bVar89),
                          -(uint)(auVar286._0_4_ != 0.0 && bVar88));
            auVar260._8_4_ = -(uint)(auVar286._8_4_ != 0.0 && bVar90);
            auVar260._12_4_ = -(uint)(auVar286._12_4_ != 0.0 && bVar91);
            iVar173 = movmskps(iVar173,auVar260);
            auVar213._8_8_ = uStack_3a0;
            auVar213._0_8_ = local_3a8;
            if (iVar173 != 0) {
              fVar264 = fVar264 * fVar219;
              fVar265 = fVar265 * fVar342;
              fVar279 = fVar279 * fVar250;
              fVar288 = fVar288 * fVar178;
              fVar179 = (float)((uint)(1.0 - fVar264) & uVar112 | ~uVar112 & (uint)fVar264);
              fVar195 = (float)((uint)(1.0 - fVar265) & uVar114 | ~uVar114 & (uint)fVar265);
              fVar242 = (float)((uint)(1.0 - fVar279) & uVar115 | ~uVar115 & (uint)fVar279);
              fVar276 = (float)((uint)(1.0 - fVar288) & uVar116 | ~uVar116 & (uint)fVar288);
              local_288 = (float)(~uVar112 & (uint)(auVar376._0_4_ * fVar219) |
                                 (uint)(1.0 - auVar376._0_4_ * fVar219) & uVar112);
              fStack_284 = (float)(~uVar114 & (uint)(auVar376._4_4_ * fVar342) |
                                  (uint)(1.0 - auVar376._4_4_ * fVar342) & uVar114);
              fStack_280 = (float)(~uVar115 & (uint)(auVar376._8_4_ * fVar250) |
                                  (uint)(1.0 - auVar376._8_4_ * fVar250) & uVar115);
              fStack_27c = (float)(~uVar116 & (uint)(auVar376._12_4_ * fVar178) |
                                  (uint)(1.0 - auVar376._12_4_ * fVar178) & uVar116);
              auVar213._8_4_ = auVar260._8_4_;
              auVar213._0_8_ = auVar260._0_8_;
              auVar213._12_4_ = auVar260._12_4_;
              aVar340.v[2] = fVar266;
              aVar340.v[3] = fVar277;
              aVar338 = aVar340;
            }
          }
          iVar173 = movmskps(iVar173,auVar213);
          if (iVar173 != 0) {
            fVar219 = (auVar375._0_4_ - auVar192._0_4_) * fVar179 + auVar192._0_4_;
            fVar342 = (auVar375._4_4_ - auVar192._4_4_) * fVar195 + auVar192._4_4_;
            fVar250 = (auVar375._8_4_ - auVar192._8_4_) * fVar242 + auVar192._8_4_;
            fVar261 = (auVar375._12_4_ - auVar192._12_4_) * fVar276 + auVar192._12_4_;
            fVar215 = *(float *)((long)local_350->ray_space + k * 4 + -0x10);
            aVar170._0_4_ = -(uint)(fVar215 * (fVar219 + fVar219) < aVar338.v[0]) & auVar213._0_4_;
            aVar170._4_4_ = -(uint)(fVar215 * (fVar342 + fVar342) < aVar338.v[1]) & auVar213._4_4_;
            aVar170._8_4_ = -(uint)(fVar215 * (fVar250 + fVar250) < aVar338.v[2]) & auVar213._8_4_;
            aVar170._12_4_ = -(uint)(fVar215 * (fVar261 + fVar261) < aVar338.v[3]) & auVar213._12_4_
            ;
            uVar112 = movmskps((int)local_350,(undefined1  [16])aVar170);
            if (uVar112 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.U.field_0.v[1] = fVar195;
              bhit.U.field_0.v[0] = fVar179;
              bhit.U.field_0.v[2] = fVar242;
              bhit.U.field_0.v[3] = fVar276;
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
                   CONCAT44(fStack_394,local_398);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
                   CONCAT44(fStack_38c,fStack_390);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
                   CONCAT44(fVar321,fVar312);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
                   CONCAT44(fVar323,fVar322);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
                   CONCAT44(fVar358,fVar356);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
                   CONCAT44(fVar370,fVar360);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
                   CONCAT44(fVar300,fVar355);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
                   CONCAT44(fVar309,fVar307);
              pGVar26 = (context->scene->geometries).items[local_3b0].ptr;
              pRVar106 = context;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.T.field_0 = aVar338;
              bhit.i = uVar113;
              bhit.valid.field_0 = aVar170;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar105 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar118;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar105 = (RTCIntersectArguments *)
                                  CONCAT71((int7)((ulong)context->args >> 8),1), bhit.N = iVar118,
                      pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar215 = (float)(int)uVar113;
                bhit.vu.field_0.v[0] = (fVar215 + fVar179 + 0.0) * local_78;
                bhit.vu.field_0.v[1] = (fVar215 + fVar195 + 1.0) * fStack_74;
                bhit.vu.field_0.v[2] = (fVar215 + fVar242 + 2.0) * fStack_70;
                bhit.vu.field_0.v[3] = (fVar215 + fVar276 + 3.0) * fStack_6c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0 = aVar338;
                pRVar106 = (RayQueryContext *)(ulong)(uVar112 & 0xff);
                uVar110 = 0;
                if (pRVar106 != (RayQueryContext *)0x0) {
                  for (; ((uVar112 & 0xff) >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                  }
                }
                auVar140 = *local_358;
                bhit.N = iVar118;
                while (pRVar106 != (RayQueryContext *)0x0) {
                  local_d8 = bhit.vu.field_0.v[uVar110];
                  uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_c8 = bhit.vv.field_0.v[uVar110];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar110];
                  fVar215 = 1.0 - local_d8;
                  fVar342 = local_d8 * fVar215 + local_d8 * fVar215;
                  fVar250 = (fVar342 - local_d8 * local_d8) * 3.0;
                  fVar219 = local_d8 * local_d8 * 3.0;
                  fVar342 = (fVar215 * fVar215 - fVar342) * 3.0;
                  args.context = context->user;
                  fVar215 = fVar215 * fVar215 * -3.0;
                  local_108 = fVar215 * local_398 +
                              fVar342 * fVar312 + fVar250 * fVar356 + fVar219 * fVar355;
                  local_f8 = fVar215 * fStack_394 +
                             fVar342 * fVar321 + fVar250 * fVar358 + fVar219 * fVar300;
                  local_e8 = fVar215 * fStack_390 +
                             fVar342 * fVar322 + fVar250 * fVar360 + fVar219 * fVar307;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  local_b8 = local_318;
                  uStack_b0 = uStack_310;
                  local_a8 = CONCAT44(uStack_64,local_68);
                  uStack_a0 = CONCAT44(uStack_5c,uStack_60);
                  local_98 = (args.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (args.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  args.valid = (int *)local_3c8;
                  pRVar105 = (RTCIntersectArguments *)pGVar26->userPtr;
                  args.hit = (RTCHitN *)&local_108;
                  args.N = 4;
                  p_Var102 = pGVar26->occlusionFilterN;
                  local_3c8 = auVar140;
                  args.geometryUserPtr = pRVar105;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var102 != (RTCFilterFunctionN)0x0) {
                    p_Var102 = (RTCFilterFunctionN)(*p_Var102)(&args);
                  }
                  auVar193._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar193._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar193._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar193._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  uVar112 = movmskps((int)p_Var102,auVar193);
                  pRVar103 = (RTCRayN *)(ulong)(uVar112 ^ 0xf);
                  if ((uVar112 ^ 0xf) == 0) {
                    auVar193 = auVar193 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar105 = context->args;
                    if ((pRVar105->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar105->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar105->filter)(&args);
                    }
                    auVar171._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                    auVar171._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar171._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                    auVar171._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                    auVar193 = auVar171 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar171 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar171;
                    pRVar103 = args.ray;
                  }
                  auVar194._0_4_ = auVar193._0_4_ << 0x1f;
                  auVar194._4_4_ = auVar193._4_4_ << 0x1f;
                  auVar194._8_4_ = auVar193._8_4_ << 0x1f;
                  auVar194._12_4_ = auVar193._12_4_ << 0x1f;
                  iVar173 = movmskps((int)pRVar103,auVar194);
                  if (iVar173 != 0) {
                    pRVar105 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar105 >> 8),1);
                    goto LAB_003ab46e;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar108;
                  pRVar106 = (RayQueryContext *)((ulong)pRVar106 ^ 1L << (uVar110 & 0x3f));
                  uVar110 = 0;
                  if (pRVar106 != (RayQueryContext *)0x0) {
                    for (; ((ulong)pRVar106 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                    }
                  }
                }
                pRVar105 = (RTCIntersectArguments *)0x0;
              }
LAB_003ab46e:
              bVar111 = bVar111 | (byte)pRVar105;
            }
          }
        }
      }
    }
    if (bVar111 != 0) break;
    fVar197 = *(float *)(ray + k * 4 + 0x80);
    auVar191._4_4_ = -(uint)(fStack_44 <= fVar197);
    auVar191._0_4_ = -(uint)(local_48 <= fVar197);
    auVar191._8_4_ = -(uint)(fStack_40 <= fVar197);
    auVar191._12_4_ = -(uint)(fStack_3c <= fVar197);
    uVar112 = movmskps(uVar108,auVar191);
  }
  return uVar109 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }